

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined8 uVar4;
  ulong uVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar63;
  uint uVar64;
  ulong uVar65;
  ulong uVar66;
  uint uVar67;
  long lVar68;
  byte bVar70;
  uint uVar71;
  long lVar72;
  undefined4 uVar73;
  float fVar74;
  float fVar113;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar75;
  float fVar76;
  float fVar114;
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar89 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  vint4 bi_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar126 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 bi_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar178;
  float fVar193;
  float fVar195;
  vint4 bi;
  float fVar197;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar194;
  float fVar196;
  float fVar198;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar199;
  undefined1 auVar192 [32];
  float fVar200;
  float fVar201;
  float fVar221;
  float fVar224;
  vint4 ai_2;
  undefined1 auVar202 [16];
  float fVar226;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar222;
  float fVar223;
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar229;
  float fVar242;
  float fVar243;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar244;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar245;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  vint4 ai;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar260 [16];
  vint4 ai_1;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  float fVar273;
  float fVar288;
  float fVar289;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar290;
  float fVar291;
  undefined1 auVar287 [32];
  float fVar292;
  float fVar303;
  float fVar304;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar301 [32];
  float fVar305;
  undefined1 auVar302 [32];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  float fVar327;
  float fVar335;
  float fVar336;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar337;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar346;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar356 [64];
  float fVar363;
  vfloat4 a0;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCFilterFunctionNArguments local_500;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  uint auStack_480 [4];
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar69;
  undefined1 auVar259 [32];
  undefined1 auVar355 [32];
  
  PVar6 = prim[1];
  uVar65 = (ulong)(byte)PVar6;
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  lVar68 = uVar65 * 0x25;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar280 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xf + 6)));
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x11 + 6)));
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1a + 6)));
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1b + 6)));
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  fVar177 = *(float *)(prim + lVar68 + 0x12);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar347._0_4_ = fVar177 * auVar93._0_4_;
  auVar347._4_4_ = fVar177 * auVar93._4_4_;
  auVar347._8_4_ = fVar177 * auVar93._8_4_;
  auVar347._12_4_ = fVar177 * auVar93._12_4_;
  auVar251 = vcvtdq2ps_avx(auVar207);
  auVar14 = vcvtdq2ps_avx(auVar173);
  auVar129 = vcvtdq2ps_avx(auVar280);
  auVar260 = vcvtdq2ps_avx(auVar140);
  auVar15 = vcvtdq2ps_avx(auVar128);
  auVar118 = vcvtdq2ps_avx(auVar159);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1c + 6)));
  auVar148 = vcvtdq2ps_avx(auVar93);
  auVar93 = vshufps_avx(auVar347,auVar347,0);
  auVar207 = vshufps_avx(auVar347,auVar347,0x55);
  auVar173 = vshufps_avx(auVar347,auVar347,0xaa);
  fVar193 = auVar173._0_4_;
  fVar197 = auVar173._4_4_;
  fVar221 = auVar173._8_4_;
  fVar226 = auVar173._12_4_;
  fVar195 = auVar207._0_4_;
  fVar200 = auVar207._4_4_;
  fVar224 = auVar207._8_4_;
  fVar229 = auVar207._12_4_;
  fVar242 = auVar93._0_4_;
  fVar243 = auVar93._4_4_;
  fVar244 = auVar93._8_4_;
  fVar74 = auVar93._12_4_;
  auVar246._0_4_ = fVar242 * auVar251._0_4_ + auVar14._0_4_ * fVar195 + auVar129._0_4_ * fVar193;
  auVar246._4_4_ = fVar243 * auVar251._4_4_ + auVar14._4_4_ * fVar200 + auVar129._4_4_ * fVar197;
  auVar246._8_4_ = fVar244 * auVar251._8_4_ + auVar14._8_4_ * fVar224 + auVar129._8_4_ * fVar221;
  auVar246._12_4_ = fVar74 * auVar251._12_4_ + auVar14._12_4_ * fVar229 + auVar129._12_4_ * fVar226;
  auVar261._0_4_ = auVar15._0_4_ * fVar195 + auVar118._0_4_ * fVar193 + fVar242 * auVar260._0_4_;
  auVar261._4_4_ = auVar15._4_4_ * fVar200 + auVar118._4_4_ * fVar197 + fVar243 * auVar260._4_4_;
  auVar261._8_4_ = auVar15._8_4_ * fVar224 + auVar118._8_4_ * fVar221 + fVar244 * auVar260._8_4_;
  auVar261._12_4_ = auVar15._12_4_ * fVar229 + auVar118._12_4_ * fVar226 + fVar74 * auVar260._12_4_;
  auVar230._0_4_ = fVar242 * auVar119._0_4_ + fVar195 * auVar120._0_4_ + auVar148._0_4_ * fVar193;
  auVar230._4_4_ = fVar243 * auVar119._4_4_ + fVar200 * auVar120._4_4_ + auVar148._4_4_ * fVar197;
  auVar230._8_4_ = fVar244 * auVar119._8_4_ + fVar224 * auVar120._8_4_ + auVar148._8_4_ * fVar221;
  auVar230._12_4_ = fVar74 * auVar119._12_4_ + fVar229 * auVar120._12_4_ + auVar148._12_4_ * fVar226
  ;
  auVar77._8_4_ = 0x7fffffff;
  auVar77._0_8_ = 0x7fffffff7fffffff;
  auVar77._12_4_ = 0x7fffffff;
  auVar93 = vandps_avx(auVar246,auVar77);
  auVar348._8_4_ = 0x219392ef;
  auVar348._0_8_ = 0x219392ef219392ef;
  auVar348._12_4_ = 0x219392ef;
  auVar93 = vcmpps_avx(auVar93,auVar348,1);
  auVar140 = vblendvps_avx(auVar246,auVar348,auVar93);
  auVar93 = vandps_avx(auVar261,auVar77);
  auVar93 = vcmpps_avx(auVar93,auVar348,1);
  auVar128 = vblendvps_avx(auVar261,auVar348,auVar93);
  auVar93 = vandps_avx(auVar230,auVar77);
  auVar93 = vcmpps_avx(auVar93,auVar348,1);
  auVar159 = vblendvps_avx(auVar230,auVar348,auVar93);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar93 = vsubps_avx(auVar93,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar349._0_4_ = fVar177 * auVar93._0_4_;
  auVar349._4_4_ = fVar177 * auVar93._4_4_;
  auVar349._8_4_ = fVar177 * auVar93._8_4_;
  auVar349._12_4_ = fVar177 * auVar93._12_4_;
  auVar93 = vshufps_avx(auVar349,auVar349,0xaa);
  fVar177 = auVar93._0_4_;
  fVar195 = auVar93._4_4_;
  fVar200 = auVar93._8_4_;
  fVar224 = auVar93._12_4_;
  auVar93 = vshufps_avx(auVar349,auVar349,0x55);
  fVar193 = auVar93._0_4_;
  fVar197 = auVar93._4_4_;
  fVar221 = auVar93._8_4_;
  fVar226 = auVar93._12_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar93);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar207 = vpmovsxwd_avx(auVar207);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar173 = vpmovsxwd_avx(auVar173);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar280 = vpmovsxwd_avx(auVar280);
  auVar77 = vshufps_avx(auVar349,auVar349,0);
  fVar229 = auVar77._0_4_;
  fVar242 = auVar77._4_4_;
  fVar243 = auVar77._8_4_;
  fVar244 = auVar77._12_4_;
  auVar357._0_4_ = fVar193 * auVar14._0_4_ + fVar177 * auVar129._0_4_ + fVar229 * auVar251._0_4_;
  auVar357._4_4_ = fVar197 * auVar14._4_4_ + fVar195 * auVar129._4_4_ + fVar242 * auVar251._4_4_;
  auVar357._8_4_ = fVar221 * auVar14._8_4_ + fVar200 * auVar129._8_4_ + fVar243 * auVar251._8_4_;
  auVar357._12_4_ = fVar226 * auVar14._12_4_ + fVar224 * auVar129._12_4_ + fVar244 * auVar251._12_4_
  ;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar251 = vpmovsxwd_avx(auVar251);
  auVar147._0_4_ = fVar229 * auVar260._0_4_ + fVar193 * auVar15._0_4_ + fVar177 * auVar118._0_4_;
  auVar147._4_4_ = fVar242 * auVar260._4_4_ + fVar197 * auVar15._4_4_ + fVar195 * auVar118._4_4_;
  auVar147._8_4_ = fVar243 * auVar260._8_4_ + fVar221 * auVar15._8_4_ + fVar200 * auVar118._8_4_;
  auVar147._12_4_ = fVar244 * auVar260._12_4_ + fVar226 * auVar15._12_4_ + fVar224 * auVar118._12_4_
  ;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar65 * 0x16 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar118._0_4_ = fVar177 * auVar148._0_4_ + fVar193 * auVar120._0_4_ + fVar229 * auVar119._0_4_;
  auVar118._4_4_ = fVar195 * auVar148._4_4_ + fVar197 * auVar120._4_4_ + fVar242 * auVar119._4_4_;
  auVar118._8_4_ = fVar200 * auVar148._8_4_ + fVar221 * auVar120._8_4_ + fVar243 * auVar119._8_4_;
  auVar118._12_4_ =
       fVar224 * auVar148._12_4_ + fVar226 * auVar120._12_4_ + fVar244 * auVar119._12_4_;
  auVar129 = vrcpps_avx(auVar140);
  fVar177 = auVar129._0_4_;
  auVar247._0_4_ = fVar177 * auVar140._0_4_;
  fVar193 = auVar129._4_4_;
  auVar247._4_4_ = fVar193 * auVar140._4_4_;
  fVar195 = auVar129._8_4_;
  auVar247._8_4_ = fVar195 * auVar140._8_4_;
  fVar197 = auVar129._12_4_;
  auVar247._12_4_ = fVar197 * auVar140._12_4_;
  auVar342._8_4_ = 0x3f800000;
  auVar342._0_8_ = 0x3f8000003f800000;
  auVar342._12_4_ = 0x3f800000;
  auVar140 = vsubps_avx(auVar342,auVar247);
  fVar177 = fVar177 + fVar177 * auVar140._0_4_;
  fVar193 = fVar193 + fVar193 * auVar140._4_4_;
  fVar195 = fVar195 + fVar195 * auVar140._8_4_;
  fVar197 = fVar197 + fVar197 * auVar140._12_4_;
  auVar140 = vrcpps_avx(auVar128);
  fVar200 = auVar140._0_4_;
  auVar202._0_4_ = fVar200 * auVar128._0_4_;
  fVar221 = auVar140._4_4_;
  auVar202._4_4_ = fVar221 * auVar128._4_4_;
  fVar224 = auVar140._8_4_;
  auVar202._8_4_ = fVar224 * auVar128._8_4_;
  fVar226 = auVar140._12_4_;
  auVar202._12_4_ = fVar226 * auVar128._12_4_;
  auVar140 = vsubps_avx(auVar342,auVar202);
  fVar200 = fVar200 + fVar200 * auVar140._0_4_;
  fVar221 = fVar221 + fVar221 * auVar140._4_4_;
  fVar224 = fVar224 + fVar224 * auVar140._8_4_;
  fVar226 = fVar226 + fVar226 * auVar140._12_4_;
  auVar140 = vrcpps_avx(auVar159);
  fVar229 = auVar140._0_4_;
  auVar231._0_4_ = fVar229 * auVar159._0_4_;
  fVar242 = auVar140._4_4_;
  auVar231._4_4_ = fVar242 * auVar159._4_4_;
  fVar243 = auVar140._8_4_;
  auVar231._8_4_ = fVar243 * auVar159._8_4_;
  fVar244 = auVar140._12_4_;
  auVar231._12_4_ = fVar244 * auVar159._12_4_;
  auVar140 = vsubps_avx(auVar342,auVar231);
  fVar229 = fVar229 + fVar229 * auVar140._0_4_;
  fVar242 = fVar242 + fVar242 * auVar140._4_4_;
  fVar243 = fVar243 + fVar243 * auVar140._8_4_;
  fVar244 = fVar244 + fVar244 * auVar140._12_4_;
  auVar140 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar68 + 0x16)) *
                           *(float *)(prim + lVar68 + 0x1a)));
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar93);
  fVar74 = auVar140._0_4_;
  fVar75 = auVar140._4_4_;
  fVar76 = auVar140._8_4_;
  fVar113 = auVar140._12_4_;
  auVar248._0_4_ = fVar74 * auVar207._0_4_ + auVar93._0_4_;
  auVar248._4_4_ = fVar75 * auVar207._4_4_ + auVar93._4_4_;
  auVar248._8_4_ = fVar76 * auVar207._8_4_ + auVar93._8_4_;
  auVar248._12_4_ = fVar113 * auVar207._12_4_ + auVar93._12_4_;
  auVar93 = vcvtdq2ps_avx(auVar173);
  auVar207 = vcvtdq2ps_avx(auVar280);
  auVar207 = vsubps_avx(auVar207,auVar93);
  auVar262._0_4_ = fVar74 * auVar207._0_4_ + auVar93._0_4_;
  auVar262._4_4_ = fVar75 * auVar207._4_4_ + auVar93._4_4_;
  auVar262._8_4_ = fVar76 * auVar207._8_4_ + auVar93._8_4_;
  auVar262._12_4_ = fVar113 * auVar207._12_4_ + auVar93._12_4_;
  auVar93 = vcvtdq2ps_avx(auVar251);
  auVar207 = vcvtdq2ps_avx(auVar14);
  auVar207 = vsubps_avx(auVar207,auVar93);
  auVar274._0_4_ = auVar93._0_4_ + fVar74 * auVar207._0_4_;
  auVar274._4_4_ = auVar93._4_4_ + fVar75 * auVar207._4_4_;
  auVar274._8_4_ = auVar93._8_4_ + fVar76 * auVar207._8_4_;
  auVar274._12_4_ = auVar93._12_4_ + fVar113 * auVar207._12_4_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar65 * 0x14 + 6);
  auVar93 = vpmovsxwd_avx(auVar140);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar65 * 0x18 + 6);
  auVar207 = vpmovsxwd_avx(auVar128);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar93);
  auVar293._0_4_ = fVar74 * auVar207._0_4_ + auVar93._0_4_;
  auVar293._4_4_ = fVar75 * auVar207._4_4_ + auVar93._4_4_;
  auVar293._8_4_ = fVar76 * auVar207._8_4_ + auVar93._8_4_;
  auVar293._12_4_ = fVar113 * auVar207._12_4_ + auVar93._12_4_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar65 * 0x1d + 6);
  auVar93 = vpmovsxwd_avx(auVar159);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar65 * 0x21 + 6);
  auVar207 = vpmovsxwd_avx(auVar129);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar173 = vsubps_avx(auVar207,auVar93);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar65 * 0x1f + 6);
  auVar207 = vpmovsxwd_avx(auVar260);
  auVar309._0_4_ = fVar74 * auVar173._0_4_ + auVar93._0_4_;
  auVar309._4_4_ = fVar75 * auVar173._4_4_ + auVar93._4_4_;
  auVar309._8_4_ = fVar76 * auVar173._8_4_ + auVar93._8_4_;
  auVar309._12_4_ = fVar113 * auVar173._12_4_ + auVar93._12_4_;
  auVar93 = vcvtdq2ps_avx(auVar207);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar65 * 0x23 + 6);
  auVar207 = vpmovsxwd_avx(auVar15);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar93);
  auVar320._0_4_ = fVar74 * auVar207._0_4_ + auVar93._0_4_;
  auVar320._4_4_ = fVar75 * auVar207._4_4_ + auVar93._4_4_;
  auVar320._8_4_ = fVar76 * auVar207._8_4_ + auVar93._8_4_;
  auVar320._12_4_ = fVar113 * auVar207._12_4_ + auVar93._12_4_;
  auVar93 = vsubps_avx(auVar248,auVar357);
  auVar249._0_4_ = fVar177 * auVar93._0_4_;
  auVar249._4_4_ = fVar193 * auVar93._4_4_;
  auVar249._8_4_ = fVar195 * auVar93._8_4_;
  auVar249._12_4_ = fVar197 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar262,auVar357);
  auVar179._0_4_ = fVar177 * auVar93._0_4_;
  auVar179._4_4_ = fVar193 * auVar93._4_4_;
  auVar179._8_4_ = fVar195 * auVar93._8_4_;
  auVar179._12_4_ = fVar197 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar274,auVar147);
  auVar263._0_4_ = fVar200 * auVar93._0_4_;
  auVar263._4_4_ = fVar221 * auVar93._4_4_;
  auVar263._8_4_ = fVar224 * auVar93._8_4_;
  auVar263._12_4_ = fVar226 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar293,auVar147);
  auVar148._0_4_ = fVar200 * auVar93._0_4_;
  auVar148._4_4_ = fVar221 * auVar93._4_4_;
  auVar148._8_4_ = fVar224 * auVar93._8_4_;
  auVar148._12_4_ = fVar226 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar309,auVar118);
  auVar203._0_4_ = fVar229 * auVar93._0_4_;
  auVar203._4_4_ = fVar242 * auVar93._4_4_;
  auVar203._8_4_ = fVar243 * auVar93._8_4_;
  auVar203._12_4_ = fVar244 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar320,auVar118);
  auVar119._0_4_ = fVar229 * auVar93._0_4_;
  auVar119._4_4_ = fVar242 * auVar93._4_4_;
  auVar119._8_4_ = fVar243 * auVar93._8_4_;
  auVar119._12_4_ = fVar244 * auVar93._12_4_;
  auVar93 = vpminsd_avx(auVar249,auVar179);
  auVar207 = vpminsd_avx(auVar263,auVar148);
  auVar93 = vmaxps_avx(auVar93,auVar207);
  auVar207 = vpminsd_avx(auVar203,auVar119);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar294._4_4_ = uVar73;
  auVar294._0_4_ = uVar73;
  auVar294._8_4_ = uVar73;
  auVar294._12_4_ = uVar73;
  auVar207 = vmaxps_avx(auVar207,auVar294);
  auVar93 = vmaxps_avx(auVar93,auVar207);
  local_470._0_4_ = auVar93._0_4_ * 0.99999964;
  local_470._4_4_ = auVar93._4_4_ * 0.99999964;
  local_470._8_4_ = auVar93._8_4_ * 0.99999964;
  local_470._12_4_ = auVar93._12_4_ * 0.99999964;
  auVar93 = vpmaxsd_avx(auVar249,auVar179);
  auVar207 = vpmaxsd_avx(auVar263,auVar148);
  auVar93 = vminps_avx(auVar93,auVar207);
  auVar207 = vpmaxsd_avx(auVar203,auVar119);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar180._4_4_ = uVar73;
  auVar180._0_4_ = uVar73;
  auVar180._8_4_ = uVar73;
  auVar180._12_4_ = uVar73;
  auVar207 = vminps_avx(auVar207,auVar180);
  auVar93 = vminps_avx(auVar93,auVar207);
  auVar120._0_4_ = auVar93._0_4_ * 1.0000004;
  auVar120._4_4_ = auVar93._4_4_ * 1.0000004;
  auVar120._8_4_ = auVar93._8_4_ * 1.0000004;
  auVar120._12_4_ = auVar93._12_4_ * 1.0000004;
  auVar93 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar207 = vpcmpgtd_avx(auVar93,_DAT_01f4ad30);
  auVar93 = vcmpps_avx(local_470,auVar120,2);
  auVar93 = vandps_avx(auVar93,auVar207);
  uVar73 = vmovmskps_avx(auVar93);
  uVar65 = CONCAT44((int)((ulong)prim >> 0x20),uVar73);
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  uVar71 = 1 << ((byte)k & 0x1f);
  local_2e0 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  auVar53 = ZEXT412(0);
LAB_0094d112:
  auVar55._12_4_ = 0;
  auVar55._0_12_ = auVar53;
  if (uVar65 == 0) {
    return;
  }
  lVar68 = 0;
  if (uVar65 != 0) {
    for (; (uVar65 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar64 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar64].ptr;
  fVar177 = (pGVar8->time_range).lower;
  fVar177 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar177) / ((pGVar8->time_range).upper - fVar177));
  auVar93 = vroundss_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),9);
  auVar93 = vminss_avx(auVar93,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar93 = vmaxss_avx(auVar55 << 0x20,auVar93);
  uVar7 = *(uint *)(prim + lVar68 * 4 + 6);
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)auVar93._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar72);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar72);
  pfVar3 = (float *)(lVar10 + lVar11 * uVar66);
  fVar193 = *pfVar3;
  fVar195 = pfVar3[1];
  fVar197 = pfVar3[2];
  fVar200 = pfVar3[3];
  lVar68 = uVar66 + 1;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar68);
  fVar221 = *pfVar3;
  fVar224 = pfVar3[1];
  fVar226 = pfVar3[2];
  fVar229 = pfVar3[3];
  lVar1 = uVar66 + 2;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar1);
  fVar242 = *pfVar3;
  fVar243 = pfVar3[1];
  fVar244 = pfVar3[2];
  fVar74 = pfVar3[3];
  lVar2 = uVar66 + 3;
  pfVar3 = (float *)(lVar10 + lVar11 * lVar2);
  fVar75 = *pfVar3;
  fVar76 = pfVar3[1];
  fVar113 = pfVar3[2];
  fVar114 = pfVar3[3];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar72);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar72);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar66);
  fVar178 = *pfVar3;
  fVar194 = pfVar3[1];
  fVar196 = pfVar3[2];
  fVar198 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar68);
  fVar201 = *pfVar3;
  fVar222 = pfVar3[1];
  fVar225 = pfVar3[2];
  fVar227 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar115 = *pfVar3;
  fVar116 = pfVar3[1];
  fVar117 = pfVar3[2];
  fVar199 = pfVar3[3];
  fVar177 = fVar177 - auVar93._0_4_;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar245 = *pfVar3;
  fVar223 = pfVar3[1];
  fVar273 = pfVar3[2];
  fVar228 = pfVar3[3];
  auVar78._0_4_ = fVar221 * 0.0 + fVar242 * 0.5 + fVar75 * 0.0;
  auVar78._4_4_ = fVar224 * 0.0 + fVar243 * 0.5 + fVar76 * 0.0;
  auVar78._8_4_ = fVar226 * 0.0 + fVar244 * 0.5 + fVar113 * 0.0;
  auVar78._12_4_ = fVar229 * 0.0 + fVar74 * 0.5 + fVar114 * 0.0;
  auVar149._0_4_ = fVar193 * 0.5;
  auVar149._4_4_ = fVar195 * 0.5;
  auVar149._8_4_ = fVar197 * 0.5;
  auVar149._12_4_ = fVar200 * 0.5;
  auVar128 = vsubps_avx(auVar78,auVar149);
  auVar79._0_4_ = fVar201 * 0.0 + fVar115 * 0.5 + fVar245 * 0.0;
  auVar79._4_4_ = fVar222 * 0.0 + fVar116 * 0.5 + fVar223 * 0.0;
  auVar79._8_4_ = fVar225 * 0.0 + fVar117 * 0.5 + fVar273 * 0.0;
  auVar79._12_4_ = fVar227 * 0.0 + fVar199 * 0.5 + fVar228 * 0.0;
  auVar350._0_4_ = fVar178 * 0.5;
  auVar350._4_4_ = fVar194 * 0.5;
  auVar350._8_4_ = fVar196 * 0.5;
  auVar350._12_4_ = fVar198 * 0.5;
  auVar280 = vsubps_avx(auVar79,auVar350);
  local_700._0_4_ = fVar193 * -0.0 + fVar242 * 0.0 + fVar75 * -0.0 + fVar221;
  local_700._4_4_ = fVar195 * -0.0 + fVar243 * 0.0 + fVar76 * -0.0 + fVar224;
  fStack_6f8 = fVar197 * -0.0 + fVar244 * 0.0 + fVar113 * -0.0 + fVar226;
  fStack_6f4 = fVar200 * -0.0 + fVar74 * 0.0 + fVar114 * -0.0 + fVar229;
  local_6d0._0_4_ = fVar193 * -0.0 + fVar221 * 0.0 + fVar242 + fVar75 * -0.0;
  local_6d0._4_4_ = fVar195 * -0.0 + fVar224 * 0.0 + fVar243 + fVar76 * -0.0;
  fStack_6c8 = fVar197 * -0.0 + fVar226 * 0.0 + fVar244 + fVar113 * -0.0;
  fStack_6c4 = fVar200 * -0.0 + fVar229 * 0.0 + fVar74 + fVar114 * -0.0;
  auVar275._0_4_ = fVar242 * 0.0 + fVar75 * 0.5;
  auVar275._4_4_ = fVar243 * 0.0 + fVar76 * 0.5;
  auVar275._8_4_ = fVar244 * 0.0 + fVar113 * 0.5;
  auVar275._12_4_ = fVar74 * 0.0 + fVar114 * 0.5;
  auVar204._0_4_ = fVar221 * 0.5;
  auVar204._4_4_ = fVar224 * 0.5;
  auVar204._8_4_ = fVar226 * 0.5;
  auVar204._12_4_ = fVar229 * 0.5;
  auVar93 = vsubps_avx(auVar275,auVar204);
  auVar358._0_4_ = fVar178 * -0.0 + fVar115 * 0.0 + fVar245 * -0.0 + fVar201;
  auVar358._4_4_ = fVar194 * -0.0 + fVar116 * 0.0 + fVar223 * -0.0 + fVar222;
  auVar358._8_4_ = fVar196 * -0.0 + fVar117 * 0.0 + fVar273 * -0.0 + fVar225;
  auVar358._12_4_ = fVar198 * -0.0 + fVar199 * 0.0 + fVar228 * -0.0 + fVar227;
  auVar295._0_4_ = fVar193 * 0.0 + auVar93._0_4_;
  auVar295._4_4_ = fVar195 * 0.0 + auVar93._4_4_;
  auVar295._8_4_ = fVar197 * 0.0 + auVar93._8_4_;
  auVar295._12_4_ = fVar200 * 0.0 + auVar93._12_4_;
  auVar181._0_4_ = fVar178 * -0.0 + fVar201 * 0.0 + fVar115 + fVar245 * -0.0;
  auVar181._4_4_ = fVar194 * -0.0 + fVar222 * 0.0 + fVar116 + fVar223 * -0.0;
  auVar181._8_4_ = fVar196 * -0.0 + fVar225 * 0.0 + fVar117 + fVar273 * -0.0;
  auVar181._12_4_ = fVar198 * -0.0 + fVar227 * 0.0 + fVar199 + fVar228 * -0.0;
  auVar205._0_4_ = fVar115 * 0.0 + fVar245 * 0.5;
  auVar205._4_4_ = fVar116 * 0.0 + fVar223 * 0.5;
  auVar205._8_4_ = fVar117 * 0.0 + fVar273 * 0.5;
  auVar205._12_4_ = fVar199 * 0.0 + fVar228 * 0.5;
  auVar264._0_4_ = fVar201 * 0.5;
  auVar264._4_4_ = fVar222 * 0.5;
  auVar264._8_4_ = fVar225 * 0.5;
  auVar264._12_4_ = fVar227 * 0.5;
  auVar93 = vsubps_avx(auVar205,auVar264);
  auVar206._0_4_ = fVar178 * 0.0 + auVar93._0_4_;
  auVar206._4_4_ = fVar194 * 0.0 + auVar93._4_4_;
  auVar206._8_4_ = fVar196 * 0.0 + auVar93._8_4_;
  auVar206._12_4_ = fVar198 * 0.0 + auVar93._12_4_;
  auVar93 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar207 = vshufps_avx(auVar358,auVar358,0xc9);
  fVar288 = auVar128._0_4_;
  auVar232._0_4_ = fVar288 * auVar207._0_4_;
  fVar327 = auVar128._4_4_;
  auVar232._4_4_ = fVar327 * auVar207._4_4_;
  fVar289 = auVar128._8_4_;
  auVar232._8_4_ = fVar289 * auVar207._8_4_;
  fVar335 = auVar128._12_4_;
  auVar232._12_4_ = fVar335 * auVar207._12_4_;
  auVar276._0_4_ = auVar358._0_4_ * auVar93._0_4_;
  auVar276._4_4_ = auVar358._4_4_ * auVar93._4_4_;
  auVar276._8_4_ = auVar358._8_4_ * auVar93._8_4_;
  auVar276._12_4_ = auVar358._12_4_ * auVar93._12_4_;
  auVar207 = vsubps_avx(auVar276,auVar232);
  auVar173 = vshufps_avx(auVar207,auVar207,0xc9);
  auVar207 = vshufps_avx(auVar280,auVar280,0xc9);
  auVar277._0_4_ = auVar207._0_4_ * fVar288;
  auVar277._4_4_ = auVar207._4_4_ * fVar327;
  auVar277._8_4_ = auVar207._8_4_ * fVar289;
  auVar277._12_4_ = auVar207._12_4_ * fVar335;
  auVar80._0_4_ = auVar93._0_4_ * auVar280._0_4_;
  auVar80._4_4_ = auVar93._4_4_ * auVar280._4_4_;
  auVar80._8_4_ = auVar93._8_4_ * auVar280._8_4_;
  auVar80._12_4_ = auVar93._12_4_ * auVar280._12_4_;
  auVar93 = vsubps_avx(auVar80,auVar277);
  auVar280 = vshufps_avx(auVar93,auVar93,0xc9);
  auVar93 = vshufps_avx(auVar295,auVar295,0xc9);
  auVar207 = vshufps_avx(auVar181,auVar181,0xc9);
  auVar278._0_4_ = auVar295._0_4_ * auVar207._0_4_;
  auVar278._4_4_ = auVar295._4_4_ * auVar207._4_4_;
  auVar278._8_4_ = auVar295._8_4_ * auVar207._8_4_;
  auVar278._12_4_ = auVar295._12_4_ * auVar207._12_4_;
  auVar182._0_4_ = auVar93._0_4_ * auVar181._0_4_;
  auVar182._4_4_ = auVar93._4_4_ * auVar181._4_4_;
  auVar182._8_4_ = auVar93._8_4_ * auVar181._8_4_;
  auVar182._12_4_ = auVar93._12_4_ * auVar181._12_4_;
  auVar207 = vsubps_avx(auVar182,auVar278);
  auVar251 = vshufps_avx(auVar207,auVar207,0xc9);
  auVar207 = vshufps_avx(auVar206,auVar206,0xc9);
  auVar279._0_4_ = auVar295._0_4_ * auVar207._0_4_;
  auVar279._4_4_ = auVar295._4_4_ * auVar207._4_4_;
  auVar279._8_4_ = auVar295._8_4_ * auVar207._8_4_;
  auVar279._12_4_ = auVar295._12_4_ * auVar207._12_4_;
  auVar81._0_4_ = auVar93._0_4_ * auVar206._0_4_;
  auVar81._4_4_ = auVar93._4_4_ * auVar206._4_4_;
  auVar81._8_4_ = auVar93._8_4_ * auVar206._8_4_;
  auVar81._12_4_ = auVar93._12_4_ * auVar206._12_4_;
  auVar93 = vdpps_avx(auVar173,auVar173,0x7f);
  auVar207 = vsubps_avx(auVar81,auVar279);
  auVar14 = vshufps_avx(auVar207,auVar207,0xc9);
  fVar195 = auVar93._0_4_;
  auVar129 = ZEXT416((uint)fVar195);
  auVar207 = vrsqrtss_avx(auVar129,auVar129);
  fVar193 = auVar207._0_4_;
  auVar207 = ZEXT416((uint)(fVar193 * 1.5 - fVar195 * 0.5 * fVar193 * fVar193 * fVar193));
  auVar140 = vshufps_avx(auVar207,auVar207,0);
  fVar201 = auVar140._0_4_ * auVar173._0_4_;
  fVar222 = auVar140._4_4_ * auVar173._4_4_;
  fVar225 = auVar140._8_4_ * auVar173._8_4_;
  fVar227 = auVar140._12_4_ * auVar173._12_4_;
  auVar207 = vdpps_avx(auVar173,auVar280,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar265._0_4_ = auVar93._0_4_ * auVar280._0_4_;
  auVar265._4_4_ = auVar93._4_4_ * auVar280._4_4_;
  auVar265._8_4_ = auVar93._8_4_ * auVar280._8_4_;
  auVar265._12_4_ = auVar93._12_4_ * auVar280._12_4_;
  auVar93 = vshufps_avx(auVar207,auVar207,0);
  auVar233._0_4_ = auVar93._0_4_ * auVar173._0_4_;
  auVar233._4_4_ = auVar93._4_4_ * auVar173._4_4_;
  auVar233._8_4_ = auVar93._8_4_ * auVar173._8_4_;
  auVar233._12_4_ = auVar93._12_4_ * auVar173._12_4_;
  auVar159 = vsubps_avx(auVar265,auVar233);
  auVar93 = vrcpss_avx(auVar129,auVar129);
  auVar93 = ZEXT416((uint)((2.0 - fVar195 * auVar93._0_4_) * auVar93._0_4_));
  auVar173 = vshufps_avx(auVar93,auVar93,0);
  auVar93 = vdpps_avx(auVar251,auVar251,0x7f);
  fVar115 = auVar93._0_4_;
  auVar280 = ZEXT416((uint)fVar115);
  auVar207 = vrsqrtss_avx(auVar280,auVar280);
  fVar178 = auVar207._0_4_;
  auVar207 = vdpps_avx(auVar251,auVar14,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar359._0_4_ = auVar93._0_4_ * auVar14._0_4_;
  auVar359._4_4_ = auVar93._4_4_ * auVar14._4_4_;
  auVar359._8_4_ = auVar93._8_4_ * auVar14._8_4_;
  auVar359._12_4_ = auVar93._12_4_ * auVar14._12_4_;
  lVar11 = *(long *)(_Var9 + 0x38 + lVar72);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar72);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar66);
  fVar193 = *pfVar3;
  fVar195 = pfVar3[1];
  fVar197 = pfVar3[2];
  fVar200 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar68);
  fVar221 = *pfVar3;
  fVar224 = pfVar3[1];
  fVar226 = pfVar3[2];
  fVar229 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar242 = *pfVar3;
  fVar243 = pfVar3[1];
  fVar244 = pfVar3[2];
  fVar74 = pfVar3[3];
  auVar93 = vshufps_avx(auVar207,auVar207,0);
  auVar82._0_4_ = auVar93._0_4_ * auVar251._0_4_;
  auVar82._4_4_ = auVar93._4_4_ * auVar251._4_4_;
  auVar82._8_4_ = auVar93._8_4_ * auVar251._8_4_;
  auVar82._12_4_ = auVar93._12_4_ * auVar251._12_4_;
  auVar14 = vsubps_avx(auVar359,auVar82);
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar75 = *pfVar3;
  fVar76 = pfVar3[1];
  fVar113 = pfVar3[2];
  fVar114 = pfVar3[3];
  lVar11 = *(long *)(lVar10 + 0x38 + lVar72);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar72);
  auVar93 = ZEXT416((uint)(fVar178 * 1.5 - fVar115 * 0.5 * fVar178 * fVar178 * fVar178));
  auVar207 = vshufps_avx(auVar93,auVar93,0);
  fVar178 = auVar207._0_4_ * auVar251._0_4_;
  fVar194 = auVar207._4_4_ * auVar251._4_4_;
  fVar196 = auVar207._8_4_ * auVar251._8_4_;
  fVar198 = auVar207._12_4_ * auVar251._12_4_;
  auVar93 = vrcpss_avx(auVar280,auVar280);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - auVar93._0_4_ * fVar115)));
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar280 = vshufps_avx(_local_700,_local_700,0xff);
  auVar328._0_4_ = auVar280._0_4_ * fVar201;
  auVar328._4_4_ = auVar280._4_4_ * fVar222;
  auVar328._8_4_ = auVar280._8_4_ * fVar225;
  auVar328._12_4_ = auVar280._12_4_ * fVar227;
  auVar251 = vshufps_avx(auVar128,auVar128,0xff);
  auVar129 = vsubps_avx(_local_700,auVar328);
  auVar266._0_4_ =
       auVar251._0_4_ * fVar201 + auVar280._0_4_ * auVar140._0_4_ * auVar159._0_4_ * auVar173._0_4_;
  auVar266._4_4_ =
       auVar251._4_4_ * fVar222 + auVar280._4_4_ * auVar140._4_4_ * auVar159._4_4_ * auVar173._4_4_;
  auVar266._8_4_ =
       auVar251._8_4_ * fVar225 + auVar280._8_4_ * auVar140._8_4_ * auVar159._8_4_ * auVar173._8_4_;
  auVar266._12_4_ =
       auVar251._12_4_ * fVar227 +
       auVar280._12_4_ * auVar140._12_4_ * auVar159._12_4_ * auVar173._12_4_;
  auVar159 = vsubps_avx(auVar128,auVar266);
  local_700._0_4_ = auVar328._0_4_ + (float)local_700._0_4_;
  local_700._4_4_ = auVar328._4_4_ + (float)local_700._4_4_;
  fStack_6f8 = auVar328._8_4_ + fStack_6f8;
  fStack_6f4 = auVar328._12_4_ + fStack_6f4;
  auVar173 = vshufps_avx(_local_6d0,_local_6d0,0xff);
  auVar150._0_4_ = auVar173._0_4_ * fVar178;
  auVar150._4_4_ = auVar173._4_4_ * fVar194;
  auVar150._8_4_ = auVar173._8_4_ * fVar196;
  auVar150._12_4_ = auVar173._12_4_ * fVar198;
  auVar280 = vshufps_avx(auVar295,auVar295,0xff);
  auVar260 = vsubps_avx(_local_6d0,auVar150);
  auVar83._0_4_ =
       auVar280._0_4_ * fVar178 + auVar173._0_4_ * auVar207._0_4_ * auVar14._0_4_ * auVar93._0_4_;
  auVar83._4_4_ =
       auVar280._4_4_ * fVar194 + auVar173._4_4_ * auVar207._4_4_ * auVar14._4_4_ * auVar93._4_4_;
  auVar83._8_4_ =
       auVar280._8_4_ * fVar196 + auVar173._8_4_ * auVar207._8_4_ * auVar14._8_4_ * auVar93._8_4_;
  auVar83._12_4_ =
       auVar280._12_4_ * fVar198 +
       auVar173._12_4_ * auVar207._12_4_ * auVar14._12_4_ * auVar93._12_4_;
  auVar15 = vsubps_avx(auVar295,auVar83);
  local_6d0._0_4_ = (float)local_6d0._0_4_ + auVar150._0_4_;
  local_6d0._4_4_ = (float)local_6d0._4_4_ + auVar150._4_4_;
  fStack_6c8 = fStack_6c8 + auVar150._8_4_;
  fStack_6c4 = fStack_6c4 + auVar150._12_4_;
  auVar84._0_4_ = fVar221 * 0.0 + fVar242 * 0.5 + fVar75 * 0.0;
  auVar84._4_4_ = fVar224 * 0.0 + fVar243 * 0.5 + fVar76 * 0.0;
  auVar84._8_4_ = fVar226 * 0.0 + fVar244 * 0.5 + fVar113 * 0.0;
  auVar84._12_4_ = fVar229 * 0.0 + fVar74 * 0.5 + fVar114 * 0.0;
  auVar121._0_4_ = fVar193 * 0.5;
  auVar121._4_4_ = fVar195 * 0.5;
  auVar121._8_4_ = fVar197 * 0.5;
  auVar121._12_4_ = fVar200 * 0.5;
  auVar118 = vsubps_avx(auVar84,auVar121);
  pfVar3 = (float *)(lVar11 + lVar1 * lVar10);
  fVar178 = *pfVar3;
  fVar194 = pfVar3[1];
  fVar196 = pfVar3[2];
  fVar198 = pfVar3[3];
  auVar93 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  fVar245 = auVar93._0_4_;
  fVar223 = auVar93._4_4_;
  fVar273 = auVar93._8_4_;
  fVar228 = auVar93._12_4_;
  pfVar3 = (float *)(lVar11 + lVar68 * lVar10);
  fVar201 = *pfVar3;
  fVar222 = pfVar3[1];
  fVar225 = pfVar3[2];
  fVar227 = pfVar3[3];
  auVar250._0_4_ = fVar201 * 0.0 + fVar245 * 0.0 + fVar178 * 0.5;
  auVar250._4_4_ = fVar222 * 0.0 + fVar223 * 0.0 + fVar194 * 0.5;
  auVar250._8_4_ = fVar225 * 0.0 + fVar273 * 0.0 + fVar196 * 0.5;
  auVar250._12_4_ = fVar227 * 0.0 + fVar228 * 0.0 + fVar198 * 0.5;
  pfVar3 = (float *)(lVar11 + uVar66 * lVar10);
  fVar115 = *pfVar3;
  fVar116 = pfVar3[1];
  fVar117 = pfVar3[2];
  fVar199 = pfVar3[3];
  auVar281._0_4_ = fVar115 * 0.5;
  auVar281._4_4_ = fVar116 * 0.5;
  auVar281._8_4_ = fVar117 * 0.5;
  auVar281._12_4_ = fVar199 * 0.5;
  auVar207 = vsubps_avx(auVar250,auVar281);
  auVar282._0_4_ = fVar193 * -0.0 + fVar221 + fVar242 * 0.0 + fVar75 * -0.0;
  auVar282._4_4_ = fVar195 * -0.0 + fVar224 + fVar243 * 0.0 + fVar76 * -0.0;
  auVar282._8_4_ = fVar197 * -0.0 + fVar226 + fVar244 * 0.0 + fVar113 * -0.0;
  auVar282._12_4_ = fVar200 * -0.0 + fVar229 + fVar74 * 0.0 + fVar114 * -0.0;
  auVar267._0_4_ = fVar193 * -0.0 + fVar221 * 0.0 + fVar242 + fVar75 * -0.0;
  auVar267._4_4_ = fVar195 * -0.0 + fVar224 * 0.0 + fVar243 + fVar76 * -0.0;
  auVar267._8_4_ = fVar197 * -0.0 + fVar226 * 0.0 + fVar244 + fVar113 * -0.0;
  auVar267._12_4_ = fVar200 * -0.0 + fVar229 * 0.0 + fVar74 + fVar114 * -0.0;
  auVar310._0_4_ = fVar242 * 0.0 + fVar75 * 0.5;
  auVar310._4_4_ = fVar243 * 0.0 + fVar76 * 0.5;
  auVar310._8_4_ = fVar244 * 0.0 + fVar113 * 0.5;
  auVar310._12_4_ = fVar74 * 0.0 + fVar114 * 0.5;
  auVar329._0_4_ = fVar221 * 0.5;
  auVar329._4_4_ = fVar224 * 0.5;
  auVar329._8_4_ = fVar226 * 0.5;
  auVar329._12_4_ = fVar229 * 0.5;
  auVar93 = vsubps_avx(auVar310,auVar329);
  auVar321._0_4_ = fVar193 * 0.0 + auVar93._0_4_;
  auVar321._4_4_ = fVar195 * 0.0 + auVar93._4_4_;
  auVar321._8_4_ = fVar197 * 0.0 + auVar93._8_4_;
  auVar321._12_4_ = fVar200 * 0.0 + auVar93._12_4_;
  auVar311._0_4_ = fVar115 * -0.0 + fVar201 + fVar245 * -0.0 + fVar178 * 0.0;
  auVar311._4_4_ = fVar116 * -0.0 + fVar222 + fVar223 * -0.0 + fVar194 * 0.0;
  auVar311._8_4_ = fVar117 * -0.0 + fVar225 + fVar273 * -0.0 + fVar196 * 0.0;
  auVar311._12_4_ = fVar199 * -0.0 + fVar227 + fVar228 * -0.0 + fVar198 * 0.0;
  auVar122._0_4_ = fVar115 * -0.0 + fVar245 * -0.0 + fVar178 + fVar201 * 0.0;
  auVar122._4_4_ = fVar116 * -0.0 + fVar223 * -0.0 + fVar194 + fVar222 * 0.0;
  auVar122._8_4_ = fVar117 * -0.0 + fVar273 * -0.0 + fVar196 + fVar225 * 0.0;
  auVar122._12_4_ = fVar199 * -0.0 + fVar228 * -0.0 + fVar198 + fVar227 * 0.0;
  auVar151._0_4_ = fVar178 * 0.0 + fVar245 * 0.5;
  auVar151._4_4_ = fVar194 * 0.0 + fVar223 * 0.5;
  auVar151._8_4_ = fVar196 * 0.0 + fVar273 * 0.5;
  auVar151._12_4_ = fVar198 * 0.0 + fVar228 * 0.5;
  auVar183._0_4_ = fVar201 * 0.5;
  auVar183._4_4_ = fVar222 * 0.5;
  auVar183._8_4_ = fVar225 * 0.5;
  auVar183._12_4_ = fVar227 * 0.5;
  auVar93 = vsubps_avx(auVar151,auVar183);
  auVar152._0_4_ = fVar115 * 0.0 + auVar93._0_4_;
  auVar152._4_4_ = fVar116 * 0.0 + auVar93._4_4_;
  auVar152._8_4_ = fVar117 * 0.0 + auVar93._8_4_;
  auVar152._12_4_ = fVar199 * 0.0 + auVar93._12_4_;
  auVar93 = vshufps_avx(auVar311,auVar311,0xc9);
  fVar242 = auVar118._0_4_;
  auVar85._0_4_ = fVar242 * auVar93._0_4_;
  fVar243 = auVar118._4_4_;
  auVar85._4_4_ = fVar243 * auVar93._4_4_;
  fVar244 = auVar118._8_4_;
  auVar85._8_4_ = fVar244 * auVar93._8_4_;
  fVar76 = auVar118._12_4_;
  auVar85._12_4_ = fVar76 * auVar93._12_4_;
  auVar93 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar312._0_4_ = auVar311._0_4_ * auVar93._0_4_;
  auVar312._4_4_ = auVar311._4_4_ * auVar93._4_4_;
  auVar312._8_4_ = auVar311._8_4_ * auVar93._8_4_;
  auVar312._12_4_ = auVar311._12_4_ * auVar93._12_4_;
  auVar173 = vsubps_avx(auVar312,auVar85);
  auVar86._0_4_ = auVar93._0_4_ * auVar207._0_4_;
  auVar86._4_4_ = auVar93._4_4_ * auVar207._4_4_;
  auVar86._8_4_ = auVar93._8_4_ * auVar207._8_4_;
  auVar86._12_4_ = auVar93._12_4_ * auVar207._12_4_;
  auVar93 = vshufps_avx(auVar207,auVar207,0xc9);
  auVar184._0_4_ = fVar242 * auVar93._0_4_;
  auVar184._4_4_ = fVar243 * auVar93._4_4_;
  auVar184._8_4_ = fVar244 * auVar93._8_4_;
  auVar184._12_4_ = fVar76 * auVar93._12_4_;
  auVar280 = vsubps_avx(auVar86,auVar184);
  auVar93 = vshufps_avx(auVar122,auVar122,0xc9);
  auVar87._0_4_ = auVar321._0_4_ * auVar93._0_4_;
  auVar87._4_4_ = auVar321._4_4_ * auVar93._4_4_;
  auVar87._8_4_ = auVar321._8_4_ * auVar93._8_4_;
  auVar87._12_4_ = auVar321._12_4_ * auVar93._12_4_;
  auVar93 = vshufps_avx(auVar321,auVar321,0xc9);
  auVar123._0_4_ = auVar93._0_4_ * auVar122._0_4_;
  auVar123._4_4_ = auVar93._4_4_ * auVar122._4_4_;
  auVar123._8_4_ = auVar93._8_4_ * auVar122._8_4_;
  auVar123._12_4_ = auVar93._12_4_ * auVar122._12_4_;
  auVar14 = vsubps_avx(auVar123,auVar87);
  auVar124._0_4_ = auVar93._0_4_ * auVar152._0_4_;
  auVar124._4_4_ = auVar93._4_4_ * auVar152._4_4_;
  auVar124._8_4_ = auVar93._8_4_ * auVar152._8_4_;
  auVar124._12_4_ = auVar93._12_4_ * auVar152._12_4_;
  auVar93 = vshufps_avx(auVar152,auVar152,0xc9);
  auVar153._0_4_ = auVar321._0_4_ * auVar93._0_4_;
  auVar153._4_4_ = auVar321._4_4_ * auVar93._4_4_;
  auVar153._8_4_ = auVar321._8_4_ * auVar93._8_4_;
  auVar153._12_4_ = auVar321._12_4_ * auVar93._12_4_;
  auVar140 = vsubps_avx(auVar124,auVar153);
  auVar173 = vshufps_avx(auVar173,auVar173,0xc9);
  auVar93 = vdpps_avx(auVar173,auVar173,0x7f);
  fVar193 = auVar93._0_4_;
  auVar251 = ZEXT416((uint)fVar193);
  auVar207 = vrsqrtss_avx(auVar251,auVar251);
  fVar195 = auVar207._0_4_;
  auVar280 = vshufps_avx(auVar280,auVar280,0xc9);
  auVar207 = vdpps_avx(auVar173,auVar280,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar185._0_4_ = auVar93._0_4_ * auVar280._0_4_;
  auVar185._4_4_ = auVar93._4_4_ * auVar280._4_4_;
  auVar185._8_4_ = auVar93._8_4_ * auVar280._8_4_;
  auVar185._12_4_ = auVar93._12_4_ * auVar280._12_4_;
  auVar93 = vshufps_avx(auVar207,auVar207,0);
  auVar330._0_4_ = auVar93._0_4_ * auVar173._0_4_;
  auVar330._4_4_ = auVar93._4_4_ * auVar173._4_4_;
  auVar330._8_4_ = auVar93._8_4_ * auVar173._8_4_;
  auVar330._12_4_ = auVar93._12_4_ * auVar173._12_4_;
  auVar119 = vsubps_avx(auVar185,auVar330);
  auVar93 = vrcpss_avx(auVar251,auVar251);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar193 * auVar93._0_4_)));
  auVar280 = vshufps_avx(auVar93,auVar93,0);
  auVar93 = ZEXT416((uint)(fVar195 * 1.5 - fVar193 * 0.5 * fVar195 * fVar195 * fVar195));
  auVar251 = vshufps_avx(auVar93,auVar93,0);
  fVar221 = auVar173._0_4_ * auVar251._0_4_;
  fVar224 = auVar173._4_4_ * auVar251._4_4_;
  fVar226 = auVar173._8_4_ * auVar251._8_4_;
  fVar229 = auVar173._12_4_ * auVar251._12_4_;
  auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar207 = vdpps_avx(auVar14,auVar14,0x7f);
  auVar93 = vblendps_avx(auVar207,_DAT_01f45a50,0xe);
  auVar173 = vrsqrtss_avx(auVar93,auVar93);
  fVar193 = auVar173._0_4_;
  auVar140 = vshufps_avx(auVar140,auVar140,0xc9);
  auVar173 = vdpps_avx(auVar14,auVar140,0x7f);
  auVar128 = vshufps_avx(auVar207,auVar207,0);
  auVar313._0_4_ = auVar128._0_4_ * auVar140._0_4_;
  auVar313._4_4_ = auVar128._4_4_ * auVar140._4_4_;
  auVar313._8_4_ = auVar128._8_4_ * auVar140._8_4_;
  auVar313._12_4_ = auVar128._12_4_ * auVar140._12_4_;
  auVar173 = vshufps_avx(auVar173,auVar173,0);
  auVar331._0_4_ = auVar173._0_4_ * auVar14._0_4_;
  auVar331._4_4_ = auVar173._4_4_ * auVar14._4_4_;
  auVar331._8_4_ = auVar173._8_4_ * auVar14._8_4_;
  auVar331._12_4_ = auVar173._12_4_ * auVar14._12_4_;
  auVar140 = vsubps_avx(auVar313,auVar331);
  auVar93 = vrcpss_avx(auVar93,auVar93);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - auVar207._0_4_ * auVar93._0_4_)));
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar207 = ZEXT416((uint)(fVar193 * 1.5 - auVar207._0_4_ * 0.5 * fVar193 * fVar193 * fVar193));
  auVar207 = vshufps_avx(auVar207,auVar207,0);
  fVar193 = auVar14._0_4_ * auVar207._0_4_;
  fVar195 = auVar14._4_4_ * auVar207._4_4_;
  fVar197 = auVar14._8_4_ * auVar207._8_4_;
  fVar200 = auVar14._12_4_ * auVar207._12_4_;
  auVar173 = vshufps_avx(auVar118,auVar118,0xff);
  auVar14 = vshufps_avx(auVar282,auVar282,0xff);
  auVar125._0_4_ = auVar14._0_4_ * fVar221;
  auVar125._4_4_ = auVar14._4_4_ * fVar224;
  auVar125._8_4_ = auVar14._8_4_ * fVar226;
  auVar125._12_4_ = auVar14._12_4_ * fVar229;
  auVar186._0_4_ =
       auVar173._0_4_ * fVar221 + auVar251._0_4_ * auVar119._0_4_ * auVar280._0_4_ * auVar14._0_4_;
  auVar186._4_4_ =
       auVar173._4_4_ * fVar224 + auVar251._4_4_ * auVar119._4_4_ * auVar280._4_4_ * auVar14._4_4_;
  auVar186._8_4_ =
       auVar173._8_4_ * fVar226 + auVar251._8_4_ * auVar119._8_4_ * auVar280._8_4_ * auVar14._8_4_;
  auVar186._12_4_ =
       auVar173._12_4_ * fVar229 +
       auVar251._12_4_ * auVar119._12_4_ * auVar280._12_4_ * auVar14._12_4_;
  auVar251 = vsubps_avx(auVar282,auVar125);
  auVar14 = vsubps_avx(auVar118,auVar186);
  auVar173 = vshufps_avx(auVar321,auVar321,0xff);
  auVar280 = vshufps_avx(auVar267,auVar267,0xff);
  auVar296._0_4_ = auVar280._0_4_ * fVar193;
  auVar296._4_4_ = auVar280._4_4_ * fVar195;
  auVar296._8_4_ = auVar280._8_4_ * fVar197;
  auVar296._12_4_ = auVar280._12_4_ * fVar200;
  auVar154._0_4_ =
       auVar173._0_4_ * fVar193 + auVar280._0_4_ * auVar207._0_4_ * auVar140._0_4_ * auVar93._0_4_;
  auVar154._4_4_ =
       auVar173._4_4_ * fVar195 + auVar280._4_4_ * auVar207._4_4_ * auVar140._4_4_ * auVar93._4_4_;
  auVar154._8_4_ =
       auVar173._8_4_ * fVar197 + auVar280._8_4_ * auVar207._8_4_ * auVar140._8_4_ * auVar93._8_4_;
  auVar154._12_4_ =
       auVar173._12_4_ * fVar200 +
       auVar280._12_4_ * auVar207._12_4_ * auVar140._12_4_ * auVar93._12_4_;
  auVar173 = vsubps_avx(auVar267,auVar296);
  auVar343._0_4_ = auVar296._0_4_ + auVar267._0_4_;
  auVar343._4_4_ = auVar296._4_4_ + auVar267._4_4_;
  auVar343._8_4_ = auVar296._8_4_ + auVar267._8_4_;
  auVar343._12_4_ = auVar296._12_4_ + auVar267._12_4_;
  auVar280 = vsubps_avx(auVar321,auVar154);
  local_620 = auVar159._0_4_;
  fStack_61c = auVar159._4_4_;
  fStack_618 = auVar159._8_4_;
  fStack_614 = auVar159._12_4_;
  local_600 = auVar129._0_4_;
  fStack_5fc = auVar129._4_4_;
  fStack_5f8 = auVar129._8_4_;
  fStack_5f4 = auVar129._12_4_;
  auVar93 = vshufps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),0);
  auVar207 = vshufps_avx(ZEXT416((uint)(1.0 - fVar177)),ZEXT416((uint)(1.0 - fVar177)),0);
  fVar200 = auVar93._0_4_;
  fVar221 = auVar93._4_4_;
  fVar224 = auVar93._8_4_;
  fVar226 = auVar93._12_4_;
  fVar177 = auVar207._0_4_;
  fVar193 = auVar207._4_4_;
  fVar195 = auVar207._8_4_;
  fVar197 = auVar207._12_4_;
  local_490._0_4_ = fVar177 * local_600 + fVar200 * auVar251._0_4_;
  local_490._4_4_ = fVar193 * fStack_5fc + fVar221 * auVar251._4_4_;
  fStack_488 = fVar195 * fStack_5f8 + fVar224 * auVar251._8_4_;
  fStack_484 = fVar197 * fStack_5f4 + fVar226 * auVar251._12_4_;
  fVar74 = fVar177 * (local_600 + local_620 * 0.33333334) +
           fVar200 * (auVar251._0_4_ + auVar14._0_4_ * 0.33333334);
  fVar113 = fVar193 * (fStack_5fc + fStack_61c * 0.33333334) +
            fVar221 * (auVar251._4_4_ + auVar14._4_4_ * 0.33333334);
  fVar194 = fVar195 * (fStack_5f8 + fStack_618 * 0.33333334) +
            fVar224 * (auVar251._8_4_ + auVar14._8_4_ * 0.33333334);
  fVar201 = fVar197 * (fStack_5f4 + fStack_614 * 0.33333334) +
            fVar226 * (auVar251._12_4_ + auVar14._12_4_ * 0.33333334);
  local_680 = auVar15._0_4_;
  fStack_67c = auVar15._4_4_;
  fStack_678 = auVar15._8_4_;
  fStack_674 = auVar15._12_4_;
  auVar155._0_4_ = local_680 * 0.33333334;
  auVar155._4_4_ = fStack_67c * 0.33333334;
  auVar155._8_4_ = fStack_678 * 0.33333334;
  auVar155._12_4_ = fStack_674 * 0.33333334;
  auVar93 = vsubps_avx(auVar260,auVar155);
  auVar252._0_4_ = (auVar295._0_4_ + auVar83._0_4_) * 0.33333334;
  auVar252._4_4_ = (auVar295._4_4_ + auVar83._4_4_) * 0.33333334;
  auVar252._8_4_ = (auVar295._8_4_ + auVar83._8_4_) * 0.33333334;
  auVar252._12_4_ = (auVar295._12_4_ + auVar83._12_4_) * 0.33333334;
  auVar207 = vsubps_avx(_local_6d0,auVar252);
  auVar187._0_4_ = auVar280._0_4_ * 0.33333334;
  auVar187._4_4_ = auVar280._4_4_ * 0.33333334;
  auVar187._8_4_ = auVar280._8_4_ * 0.33333334;
  auVar187._12_4_ = auVar280._12_4_ * 0.33333334;
  auVar280 = vsubps_avx(auVar173,auVar187);
  auVar314._0_4_ = (auVar321._0_4_ + auVar154._0_4_) * 0.33333334;
  auVar314._4_4_ = (auVar321._4_4_ + auVar154._4_4_) * 0.33333334;
  auVar314._8_4_ = (auVar321._8_4_ + auVar154._8_4_) * 0.33333334;
  auVar314._12_4_ = (auVar321._12_4_ + auVar154._12_4_) * 0.33333334;
  auVar251 = vsubps_avx(auVar343,auVar314);
  local_4a0._0_4_ = fVar200 * auVar280._0_4_ + fVar177 * auVar93._0_4_;
  local_4a0._4_4_ = fVar221 * auVar280._4_4_ + fVar193 * auVar93._4_4_;
  fStack_498 = fVar224 * auVar280._8_4_ + fVar195 * auVar93._8_4_;
  fStack_494 = fVar226 * auVar280._12_4_ + fVar197 * auVar93._12_4_;
  fVar75 = fVar177 * auVar260._0_4_ + fVar200 * auVar173._0_4_;
  fVar114 = fVar193 * auVar260._4_4_ + fVar221 * auVar173._4_4_;
  fVar196 = fVar195 * auVar260._8_4_ + fVar224 * auVar173._8_4_;
  fVar222 = fVar197 * auVar260._12_4_ + fVar226 * auVar173._12_4_;
  local_4b0._0_4_ = (float)local_700._0_4_ * fVar177 + fVar200 * (auVar282._0_4_ + auVar125._0_4_);
  local_4b0._4_4_ = (float)local_700._4_4_ * fVar193 + fVar221 * (auVar282._4_4_ + auVar125._4_4_);
  fStack_4a8 = fStack_6f8 * fVar195 + fVar224 * (auVar282._8_4_ + auVar125._8_4_);
  fStack_4a4 = fStack_6f4 * fVar197 + fVar226 * (auVar282._12_4_ + auVar125._12_4_);
  local_4c0._0_4_ =
       fVar177 * ((float)local_700._0_4_ + (fVar288 + auVar266._0_4_) * 0.33333334) +
       fVar200 * (auVar282._0_4_ + auVar125._0_4_ + (fVar242 + auVar186._0_4_) * 0.33333334);
  local_4c0._4_4_ =
       fVar193 * ((float)local_700._4_4_ + (fVar327 + auVar266._4_4_) * 0.33333334) +
       fVar221 * (auVar282._4_4_ + auVar125._4_4_ + (fVar243 + auVar186._4_4_) * 0.33333334);
  fStack_4b8 = fVar195 * (fStack_6f8 + (fVar289 + auVar266._8_4_) * 0.33333334) +
               fVar224 * (auVar282._8_4_ + auVar125._8_4_ + (fVar244 + auVar186._8_4_) * 0.33333334)
  ;
  fStack_4b4 = fVar197 * (fStack_6f4 + (fVar335 + auVar266._12_4_) * 0.33333334) +
               fVar226 * (auVar282._12_4_ + auVar125._12_4_ +
                         (fVar76 + auVar186._12_4_) * 0.33333334);
  fVar76 = fVar177 * auVar207._0_4_ + fVar200 * auVar251._0_4_;
  fVar178 = fVar193 * auVar207._4_4_ + fVar221 * auVar251._4_4_;
  fVar198 = fVar195 * auVar207._8_4_ + fVar224 * auVar251._8_4_;
  fVar225 = fVar197 * auVar207._12_4_ + fVar226 * auVar251._12_4_;
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  local_4d0 = (float)local_6d0._0_4_ * fVar177 + fVar200 * auVar343._0_4_;
  fStack_4cc = (float)local_6d0._4_4_ * fVar193 + fVar221 * auVar343._4_4_;
  fStack_4c8 = fStack_6c8 * fVar195 + fVar224 * auVar343._8_4_;
  fStack_4c4 = fStack_6c4 * fVar197 + fVar226 * auVar343._12_4_;
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_3a0 = vsubps_avx(_local_490,auVar93);
  auVar173 = vmovsldup_avx(local_3a0);
  auVar207 = vmovshdup_avx(local_3a0);
  auVar280 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar177 = pre->ray_space[k].vx.field_0.m128[0];
  fVar193 = pre->ray_space[k].vx.field_0.m128[1];
  fVar195 = pre->ray_space[k].vx.field_0.m128[2];
  fVar197 = pre->ray_space[k].vx.field_0.m128[3];
  fVar200 = pre->ray_space[k].vy.field_0.m128[0];
  fVar221 = pre->ray_space[k].vy.field_0.m128[1];
  fVar224 = pre->ray_space[k].vy.field_0.m128[2];
  fVar226 = pre->ray_space[k].vy.field_0.m128[3];
  fVar229 = pre->ray_space[k].vz.field_0.m128[0];
  fVar242 = pre->ray_space[k].vz.field_0.m128[1];
  fVar243 = pre->ray_space[k].vz.field_0.m128[2];
  fVar244 = pre->ray_space[k].vz.field_0.m128[3];
  auVar332._0_4_ = fVar177 * auVar173._0_4_ + fVar200 * auVar207._0_4_ + fVar229 * auVar280._0_4_;
  auVar332._4_4_ = fVar193 * auVar173._4_4_ + fVar221 * auVar207._4_4_ + fVar242 * auVar280._4_4_;
  auVar332._8_4_ = fVar195 * auVar173._8_4_ + fVar224 * auVar207._8_4_ + fVar243 * auVar280._8_4_;
  auVar332._12_4_ =
       fVar197 * auVar173._12_4_ + fVar226 * auVar207._12_4_ + fVar244 * auVar280._12_4_;
  auVar60._4_4_ = fVar113;
  auVar60._0_4_ = fVar74;
  auVar60._8_4_ = fVar194;
  auVar60._12_4_ = fVar201;
  local_3b0 = vsubps_avx(auVar60,auVar93);
  auVar280 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar207 = vmovshdup_avx(local_3b0);
  auVar173 = vmovsldup_avx(local_3b0);
  auVar344._0_4_ = fVar177 * auVar173._0_4_ + fVar200 * auVar207._0_4_ + fVar229 * auVar280._0_4_;
  auVar344._4_4_ = fVar193 * auVar173._4_4_ + fVar221 * auVar207._4_4_ + fVar242 * auVar280._4_4_;
  auVar344._8_4_ = fVar195 * auVar173._8_4_ + fVar224 * auVar207._8_4_ + fVar243 * auVar280._8_4_;
  auVar344._12_4_ =
       fVar197 * auVar173._12_4_ + fVar226 * auVar207._12_4_ + fVar244 * auVar280._12_4_;
  local_3c0 = vsubps_avx(_local_4a0,auVar93);
  auVar280 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar207 = vmovshdup_avx(local_3c0);
  auVar173 = vmovsldup_avx(local_3c0);
  auVar360._0_4_ = fVar177 * auVar173._0_4_ + fVar200 * auVar207._0_4_ + fVar229 * auVar280._0_4_;
  auVar360._4_4_ = fVar193 * auVar173._4_4_ + fVar221 * auVar207._4_4_ + fVar242 * auVar280._4_4_;
  auVar360._8_4_ = fVar195 * auVar173._8_4_ + fVar224 * auVar207._8_4_ + fVar243 * auVar280._8_4_;
  auVar360._12_4_ =
       fVar197 * auVar173._12_4_ + fVar226 * auVar207._12_4_ + fVar244 * auVar280._12_4_;
  auVar58._4_4_ = fVar114;
  auVar58._0_4_ = fVar75;
  auVar58._8_4_ = fVar196;
  auVar58._12_4_ = fVar222;
  local_3d0 = vsubps_avx(auVar58,auVar93);
  auVar280 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar207 = vmovshdup_avx(local_3d0);
  auVar173 = vmovsldup_avx(local_3d0);
  auVar268._0_4_ = auVar173._0_4_ * fVar177 + auVar207._0_4_ * fVar200 + fVar229 * auVar280._0_4_;
  auVar268._4_4_ = auVar173._4_4_ * fVar193 + auVar207._4_4_ * fVar221 + fVar242 * auVar280._4_4_;
  auVar268._8_4_ = auVar173._8_4_ * fVar195 + auVar207._8_4_ * fVar224 + fVar243 * auVar280._8_4_;
  auVar268._12_4_ =
       auVar173._12_4_ * fVar197 + auVar207._12_4_ * fVar226 + fVar244 * auVar280._12_4_;
  local_3e0 = vsubps_avx(_local_4b0,auVar93);
  auVar280 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar207 = vmovshdup_avx(local_3e0);
  auVar173 = vmovsldup_avx(local_3e0);
  auVar283._0_4_ = auVar173._0_4_ * fVar177 + auVar207._0_4_ * fVar200 + auVar280._0_4_ * fVar229;
  auVar283._4_4_ = auVar173._4_4_ * fVar193 + auVar207._4_4_ * fVar221 + auVar280._4_4_ * fVar242;
  auVar283._8_4_ = auVar173._8_4_ * fVar195 + auVar207._8_4_ * fVar224 + auVar280._8_4_ * fVar243;
  auVar283._12_4_ =
       auVar173._12_4_ * fVar197 + auVar207._12_4_ * fVar226 + auVar280._12_4_ * fVar244;
  local_3f0 = vsubps_avx(_local_4c0,auVar93);
  auVar280 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar207 = vmovshdup_avx(local_3f0);
  auVar173 = vmovsldup_avx(local_3f0);
  auVar297._0_4_ = auVar173._0_4_ * fVar177 + auVar207._0_4_ * fVar200 + auVar280._0_4_ * fVar229;
  auVar297._4_4_ = auVar173._4_4_ * fVar193 + auVar207._4_4_ * fVar221 + auVar280._4_4_ * fVar242;
  auVar297._8_4_ = auVar173._8_4_ * fVar195 + auVar207._8_4_ * fVar224 + auVar280._8_4_ * fVar243;
  auVar297._12_4_ =
       auVar173._12_4_ * fVar197 + auVar207._12_4_ * fVar226 + auVar280._12_4_ * fVar244;
  auVar56._4_4_ = fVar178;
  auVar56._0_4_ = fVar76;
  auVar56._8_4_ = fVar198;
  auVar56._12_4_ = fVar225;
  local_400 = vsubps_avx(auVar56,auVar93);
  auVar280 = vshufps_avx(local_400,local_400,0xaa);
  auVar207 = vmovshdup_avx(local_400);
  auVar173 = vmovsldup_avx(local_400);
  auVar315._0_4_ = auVar173._0_4_ * fVar177 + auVar207._0_4_ * fVar200 + auVar280._0_4_ * fVar229;
  auVar315._4_4_ = auVar173._4_4_ * fVar193 + auVar207._4_4_ * fVar221 + auVar280._4_4_ * fVar242;
  auVar315._8_4_ = auVar173._8_4_ * fVar195 + auVar207._8_4_ * fVar224 + auVar280._8_4_ * fVar243;
  auVar315._12_4_ =
       auVar173._12_4_ * fVar197 + auVar207._12_4_ * fVar226 + auVar280._12_4_ * fVar244;
  auVar62._4_4_ = fStack_4cc;
  auVar62._0_4_ = local_4d0;
  auVar62._8_4_ = fStack_4c8;
  auVar62._12_4_ = fStack_4c4;
  local_410 = vsubps_avx(auVar62,auVar93);
  auVar173 = vshufps_avx(local_410,local_410,0xaa);
  auVar93 = vmovshdup_avx(local_410);
  auVar207 = vmovsldup_avx(local_410);
  auVar88._0_4_ = fVar177 * auVar207._0_4_ + fVar200 * auVar93._0_4_ + fVar229 * auVar173._0_4_;
  auVar88._4_4_ = fVar193 * auVar207._4_4_ + fVar221 * auVar93._4_4_ + fVar242 * auVar173._4_4_;
  auVar88._8_4_ = fVar195 * auVar207._8_4_ + fVar224 * auVar93._8_4_ + fVar243 * auVar173._8_4_;
  auVar88._12_4_ = fVar197 * auVar207._12_4_ + fVar226 * auVar93._12_4_ + fVar244 * auVar173._12_4_;
  auVar280 = vmovlhps_avx(auVar332,auVar283);
  auVar251 = vmovlhps_avx(auVar344,auVar297);
  auVar14 = vmovlhps_avx(auVar360,auVar315);
  _local_380 = vmovlhps_avx(auVar268,auVar88);
  auVar93 = vminps_avx(auVar280,auVar251);
  auVar207 = vminps_avx(auVar14,_local_380);
  auVar173 = vminps_avx(auVar93,auVar207);
  auVar93 = vmaxps_avx(auVar280,auVar251);
  auVar207 = vmaxps_avx(auVar14,_local_380);
  auVar93 = vmaxps_avx(auVar93,auVar207);
  auVar207 = vshufpd_avx(auVar173,auVar173,3);
  auVar173 = vminps_avx(auVar173,auVar207);
  auVar207 = vshufpd_avx(auVar93,auVar93,3);
  auVar207 = vmaxps_avx(auVar93,auVar207);
  auVar253._8_4_ = 0x7fffffff;
  auVar253._0_8_ = 0x7fffffff7fffffff;
  auVar253._12_4_ = 0x7fffffff;
  auVar93 = vandps_avx(auVar173,auVar253);
  auVar207 = vandps_avx(auVar207,auVar253);
  auVar93 = vmaxps_avx(auVar93,auVar207);
  auVar207 = vmovshdup_avx(auVar93);
  auVar93 = vmaxss_avx(auVar207,auVar93);
  fVar177 = auVar93._0_4_ * 9.536743e-07;
  local_390 = ZEXT416((uint)fVar177);
  auVar93 = vshufps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),0);
  local_1c0._16_16_ = auVar93;
  local_1c0._0_16_ = auVar93;
  auVar89._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
  auVar89._8_4_ = auVar93._8_4_ ^ 0x80000000;
  auVar89._12_4_ = auVar93._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar89;
  local_1e0._0_16_ = auVar89;
  auVar93 = vpshufd_avx(ZEXT416(uVar64),0);
  local_300._16_16_ = auVar93;
  local_300._0_16_ = auVar93;
  auVar93 = vpshufd_avx(ZEXT416(uVar7),0);
  local_320._16_16_ = auVar93;
  local_320._0_16_ = auVar93;
  uVar66 = 0;
  fVar177 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar251,auVar280);
  _local_360 = vsubps_avx(auVar14,auVar251);
  _local_370 = vsubps_avx(_local_380,auVar14);
  _local_430 = vsubps_avx(_local_4b0,_local_490);
  auVar61._4_4_ = fVar113;
  auVar61._0_4_ = fVar74;
  auVar61._8_4_ = fVar194;
  auVar61._12_4_ = fVar201;
  _local_440 = vsubps_avx(_local_4c0,auVar61);
  auVar57._4_4_ = fVar178;
  auVar57._0_4_ = fVar76;
  auVar57._8_4_ = fVar198;
  auVar57._12_4_ = fVar225;
  _local_450 = vsubps_avx(auVar57,_local_4a0);
  auVar59._4_4_ = fVar114;
  auVar59._0_4_ = fVar75;
  auVar59._8_4_ = fVar196;
  auVar59._12_4_ = fVar222;
  _local_460 = vsubps_avx(auVar62,auVar59);
  auVar356 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar362 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0094ddaf:
  do {
    local_420 = auVar362._0_16_;
    auVar119 = auVar356._0_16_;
    auVar93 = vshufps_avx(auVar119,auVar119,0x50);
    auVar351._8_4_ = 0x3f800000;
    auVar351._0_8_ = 0x3f8000003f800000;
    auVar351._12_4_ = 0x3f800000;
    auVar355._16_4_ = 0x3f800000;
    auVar355._0_16_ = auVar351;
    auVar355._20_4_ = 0x3f800000;
    auVar355._24_4_ = 0x3f800000;
    auVar355._28_4_ = 0x3f800000;
    auVar207 = vsubps_avx(auVar351,auVar93);
    fVar193 = auVar93._0_4_;
    fVar195 = auVar93._4_4_;
    fVar197 = auVar93._8_4_;
    fVar200 = auVar93._12_4_;
    fVar221 = auVar207._0_4_;
    fVar224 = auVar207._4_4_;
    fVar226 = auVar207._8_4_;
    fVar229 = auVar207._12_4_;
    auVar188._0_4_ = auVar283._0_4_ * fVar193 + fVar221 * auVar332._0_4_;
    auVar188._4_4_ = auVar283._4_4_ * fVar195 + fVar224 * auVar332._4_4_;
    auVar188._8_4_ = auVar283._0_4_ * fVar197 + fVar226 * auVar332._0_4_;
    auVar188._12_4_ = auVar283._4_4_ * fVar200 + fVar229 * auVar332._4_4_;
    auVar156._0_4_ = auVar297._0_4_ * fVar193 + auVar344._0_4_ * fVar221;
    auVar156._4_4_ = auVar297._4_4_ * fVar195 + auVar344._4_4_ * fVar224;
    auVar156._8_4_ = auVar297._0_4_ * fVar197 + auVar344._0_4_ * fVar226;
    auVar156._12_4_ = auVar297._4_4_ * fVar200 + auVar344._4_4_ * fVar229;
    auVar269._0_4_ = auVar315._0_4_ * fVar193 + auVar360._0_4_ * fVar221;
    auVar269._4_4_ = auVar315._4_4_ * fVar195 + auVar360._4_4_ * fVar224;
    auVar269._8_4_ = auVar315._0_4_ * fVar197 + auVar360._0_4_ * fVar226;
    auVar269._12_4_ = auVar315._4_4_ * fVar200 + auVar360._4_4_ * fVar229;
    auVar208._0_4_ = auVar88._0_4_ * fVar193 + auVar268._0_4_ * fVar221;
    auVar208._4_4_ = auVar88._4_4_ * fVar195 + auVar268._4_4_ * fVar224;
    auVar208._8_4_ = auVar88._0_4_ * fVar197 + auVar268._0_4_ * fVar226;
    auVar208._12_4_ = auVar88._4_4_ * fVar200 + auVar268._4_4_ * fVar229;
    auVar93 = vmovshdup_avx(local_420);
    auVar207 = vshufps_avx(local_420,local_420,0);
    auVar301._16_16_ = auVar207;
    auVar301._0_16_ = auVar207;
    auVar173 = vshufps_avx(local_420,local_420,0x55);
    auVar106._16_16_ = auVar173;
    auVar106._0_16_ = auVar173;
    auVar105 = vsubps_avx(auVar106,auVar301);
    auVar173 = vshufps_avx(auVar188,auVar188,0);
    auVar140 = vshufps_avx(auVar188,auVar188,0x55);
    auVar128 = vshufps_avx(auVar156,auVar156,0);
    auVar159 = vshufps_avx(auVar156,auVar156,0x55);
    auVar129 = vshufps_avx(auVar269,auVar269,0);
    auVar260 = vshufps_avx(auVar269,auVar269,0x55);
    auVar15 = vshufps_avx(auVar208,auVar208,0);
    auVar118 = vshufps_avx(auVar208,auVar208,0x55);
    auVar93 = ZEXT416((uint)((auVar93._0_4_ - auVar362._0_4_) * 0.04761905));
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar319._0_4_ = auVar207._0_4_ + auVar105._0_4_ * 0.0;
    auVar319._4_4_ = auVar207._4_4_ + auVar105._4_4_ * 0.14285715;
    auVar319._8_4_ = auVar207._8_4_ + auVar105._8_4_ * 0.2857143;
    auVar319._12_4_ = auVar207._12_4_ + auVar105._12_4_ * 0.42857146;
    auVar319._16_4_ = auVar207._0_4_ + auVar105._16_4_ * 0.5714286;
    auVar319._20_4_ = auVar207._4_4_ + auVar105._20_4_ * 0.71428573;
    auVar319._24_4_ = auVar207._8_4_ + auVar105._24_4_ * 0.8571429;
    auVar319._28_4_ = auVar207._12_4_ + auVar105._28_4_;
    auVar16 = vsubps_avx(auVar355,auVar319);
    fVar193 = auVar128._0_4_;
    fVar197 = auVar128._4_4_;
    fVar221 = auVar128._8_4_;
    fVar226 = auVar128._12_4_;
    fVar292 = auVar16._0_4_;
    fVar303 = auVar16._4_4_;
    fVar304 = auVar16._8_4_;
    fVar305 = auVar16._12_4_;
    fVar306 = auVar16._16_4_;
    fVar307 = auVar16._20_4_;
    fVar308 = auVar16._24_4_;
    fVar288 = auVar159._0_4_;
    fVar289 = auVar159._4_4_;
    fVar290 = auVar159._8_4_;
    fVar291 = auVar159._12_4_;
    fVar346 = auVar140._12_4_ + 1.0;
    fVar245 = auVar129._0_4_;
    fVar223 = auVar129._4_4_;
    fVar273 = auVar129._8_4_;
    fVar228 = auVar129._12_4_;
    fVar242 = fVar245 * auVar319._0_4_ + fVar292 * fVar193;
    fVar243 = fVar223 * auVar319._4_4_ + fVar303 * fVar197;
    fVar244 = fVar273 * auVar319._8_4_ + fVar304 * fVar221;
    fVar227 = fVar228 * auVar319._12_4_ + fVar305 * fVar226;
    fVar115 = fVar245 * auVar319._16_4_ + fVar306 * fVar193;
    fVar116 = fVar223 * auVar319._20_4_ + fVar307 * fVar197;
    fVar117 = fVar273 * auVar319._24_4_ + fVar308 * fVar221;
    fVar195 = auVar260._0_4_;
    fVar200 = auVar260._4_4_;
    fVar224 = auVar260._8_4_;
    fVar229 = auVar260._12_4_;
    fVar327 = fVar288 * fVar292 + auVar319._0_4_ * fVar195;
    fVar335 = fVar289 * fVar303 + auVar319._4_4_ * fVar200;
    fVar336 = fVar290 * fVar304 + auVar319._8_4_ * fVar224;
    fVar337 = fVar291 * fVar305 + auVar319._12_4_ * fVar229;
    fVar338 = fVar288 * fVar306 + auVar319._16_4_ * fVar195;
    fVar339 = fVar289 * fVar307 + auVar319._20_4_ * fVar200;
    fVar340 = fVar290 * fVar308 + auVar319._24_4_ * fVar224;
    fVar341 = fVar291 + fVar226;
    auVar207 = vshufps_avx(auVar188,auVar188,0xaa);
    auVar128 = vshufps_avx(auVar188,auVar188,0xff);
    fVar199 = fVar228 + 0.0;
    auVar159 = vshufps_avx(auVar156,auVar156,0xaa);
    auVar129 = vshufps_avx(auVar156,auVar156,0xff);
    auVar219._0_4_ =
         fVar292 * (auVar319._0_4_ * fVar193 + fVar292 * auVar173._0_4_) + auVar319._0_4_ * fVar242;
    auVar219._4_4_ =
         fVar303 * (auVar319._4_4_ * fVar197 + fVar303 * auVar173._4_4_) + auVar319._4_4_ * fVar243;
    auVar219._8_4_ =
         fVar304 * (auVar319._8_4_ * fVar221 + fVar304 * auVar173._8_4_) + auVar319._8_4_ * fVar244;
    auVar219._12_4_ =
         fVar305 * (auVar319._12_4_ * fVar226 + fVar305 * auVar173._12_4_) +
         auVar319._12_4_ * fVar227;
    auVar219._16_4_ =
         fVar306 * (auVar319._16_4_ * fVar193 + fVar306 * auVar173._0_4_) +
         auVar319._16_4_ * fVar115;
    auVar219._20_4_ =
         fVar307 * (auVar319._20_4_ * fVar197 + fVar307 * auVar173._4_4_) +
         auVar319._20_4_ * fVar116;
    auVar219._24_4_ =
         fVar308 * (auVar319._24_4_ * fVar221 + fVar308 * auVar173._8_4_) +
         auVar319._24_4_ * fVar117;
    auVar219._28_4_ = auVar173._12_4_ + 1.0 + fVar229;
    auVar240._0_4_ =
         fVar292 * (fVar288 * auVar319._0_4_ + auVar140._0_4_ * fVar292) + auVar319._0_4_ * fVar327;
    auVar240._4_4_ =
         fVar303 * (fVar289 * auVar319._4_4_ + auVar140._4_4_ * fVar303) + auVar319._4_4_ * fVar335;
    auVar240._8_4_ =
         fVar304 * (fVar290 * auVar319._8_4_ + auVar140._8_4_ * fVar304) + auVar319._8_4_ * fVar336;
    auVar240._12_4_ =
         fVar305 * (fVar291 * auVar319._12_4_ + auVar140._12_4_ * fVar305) +
         auVar319._12_4_ * fVar337;
    auVar240._16_4_ =
         fVar306 * (fVar288 * auVar319._16_4_ + auVar140._0_4_ * fVar306) +
         auVar319._16_4_ * fVar338;
    auVar240._20_4_ =
         fVar307 * (fVar289 * auVar319._20_4_ + auVar140._4_4_ * fVar307) +
         auVar319._20_4_ * fVar339;
    auVar240._24_4_ =
         fVar308 * (fVar290 * auVar319._24_4_ + auVar140._8_4_ * fVar308) +
         auVar319._24_4_ * fVar340;
    auVar240._28_4_ = auVar118._12_4_ + fVar229;
    auVar107._0_4_ =
         fVar292 * fVar242 + auVar319._0_4_ * (fVar245 * fVar292 + auVar15._0_4_ * auVar319._0_4_);
    auVar107._4_4_ =
         fVar303 * fVar243 + auVar319._4_4_ * (fVar223 * fVar303 + auVar15._4_4_ * auVar319._4_4_);
    auVar107._8_4_ =
         fVar304 * fVar244 + auVar319._8_4_ * (fVar273 * fVar304 + auVar15._8_4_ * auVar319._8_4_);
    auVar107._12_4_ =
         fVar305 * fVar227 +
         auVar319._12_4_ * (fVar228 * fVar305 + auVar15._12_4_ * auVar319._12_4_);
    auVar107._16_4_ =
         fVar306 * fVar115 + auVar319._16_4_ * (fVar245 * fVar306 + auVar15._0_4_ * auVar319._16_4_)
    ;
    auVar107._20_4_ =
         fVar307 * fVar116 + auVar319._20_4_ * (fVar223 * fVar307 + auVar15._4_4_ * auVar319._20_4_)
    ;
    auVar107._24_4_ =
         fVar308 * fVar117 + auVar319._24_4_ * (fVar273 * fVar308 + auVar15._8_4_ * auVar319._24_4_)
    ;
    auVar107._28_4_ = fVar226 + 1.0 + fVar199;
    auVar326._0_4_ =
         fVar292 * fVar327 + auVar319._0_4_ * (auVar118._0_4_ * auVar319._0_4_ + fVar292 * fVar195);
    auVar326._4_4_ =
         fVar303 * fVar335 + auVar319._4_4_ * (auVar118._4_4_ * auVar319._4_4_ + fVar303 * fVar200);
    auVar326._8_4_ =
         fVar304 * fVar336 + auVar319._8_4_ * (auVar118._8_4_ * auVar319._8_4_ + fVar304 * fVar224);
    auVar326._12_4_ =
         fVar305 * fVar337 +
         auVar319._12_4_ * (auVar118._12_4_ * auVar319._12_4_ + fVar305 * fVar229);
    auVar326._16_4_ =
         fVar306 * fVar338 +
         auVar319._16_4_ * (auVar118._0_4_ * auVar319._16_4_ + fVar306 * fVar195);
    auVar326._20_4_ =
         fVar307 * fVar339 +
         auVar319._20_4_ * (auVar118._4_4_ * auVar319._20_4_ + fVar307 * fVar200);
    auVar326._24_4_ =
         fVar308 * fVar340 +
         auVar319._24_4_ * (auVar118._8_4_ * auVar319._24_4_ + fVar308 * fVar224);
    auVar326._28_4_ = fVar199 + fVar229 + 0.0;
    local_220._0_4_ = fVar292 * auVar219._0_4_ + auVar319._0_4_ * auVar107._0_4_;
    local_220._4_4_ = fVar303 * auVar219._4_4_ + auVar319._4_4_ * auVar107._4_4_;
    local_220._8_4_ = fVar304 * auVar219._8_4_ + auVar319._8_4_ * auVar107._8_4_;
    local_220._12_4_ = fVar305 * auVar219._12_4_ + auVar319._12_4_ * auVar107._12_4_;
    local_220._16_4_ = fVar306 * auVar219._16_4_ + auVar319._16_4_ * auVar107._16_4_;
    local_220._20_4_ = fVar307 * auVar219._20_4_ + auVar319._20_4_ * auVar107._20_4_;
    local_220._24_4_ = fVar308 * auVar219._24_4_ + auVar319._24_4_ * auVar107._24_4_;
    local_220._28_4_ = fVar341 + fVar229 + 0.0;
    auVar192._0_4_ = fVar292 * auVar240._0_4_ + auVar319._0_4_ * auVar326._0_4_;
    auVar192._4_4_ = fVar303 * auVar240._4_4_ + auVar319._4_4_ * auVar326._4_4_;
    auVar192._8_4_ = fVar304 * auVar240._8_4_ + auVar319._8_4_ * auVar326._8_4_;
    auVar192._12_4_ = fVar305 * auVar240._12_4_ + auVar319._12_4_ * auVar326._12_4_;
    auVar192._16_4_ = fVar306 * auVar240._16_4_ + auVar319._16_4_ * auVar326._16_4_;
    auVar192._20_4_ = fVar307 * auVar240._20_4_ + auVar319._20_4_ * auVar326._20_4_;
    auVar192._24_4_ = fVar308 * auVar240._24_4_ + auVar319._24_4_ * auVar326._24_4_;
    auVar192._28_4_ = fVar341 + fVar199;
    auVar17 = vsubps_avx(auVar107,auVar219);
    auVar105 = vsubps_avx(auVar326,auVar240);
    local_620 = auVar93._0_4_;
    fStack_61c = auVar93._4_4_;
    fStack_618 = auVar93._8_4_;
    fStack_614 = auVar93._12_4_;
    local_260 = local_620 * auVar17._0_4_ * 3.0;
    fStack_25c = fStack_61c * auVar17._4_4_ * 3.0;
    auVar18._4_4_ = fStack_25c;
    auVar18._0_4_ = local_260;
    fStack_258 = fStack_618 * auVar17._8_4_ * 3.0;
    auVar18._8_4_ = fStack_258;
    fStack_254 = fStack_614 * auVar17._12_4_ * 3.0;
    auVar18._12_4_ = fStack_254;
    fStack_250 = local_620 * auVar17._16_4_ * 3.0;
    auVar18._16_4_ = fStack_250;
    fStack_24c = fStack_61c * auVar17._20_4_ * 3.0;
    auVar18._20_4_ = fStack_24c;
    fStack_248 = fStack_618 * auVar17._24_4_ * 3.0;
    auVar18._24_4_ = fStack_248;
    auVar18._28_4_ = auVar17._28_4_;
    local_280 = local_620 * auVar105._0_4_ * 3.0;
    fStack_27c = fStack_61c * auVar105._4_4_ * 3.0;
    auVar19._4_4_ = fStack_27c;
    auVar19._0_4_ = local_280;
    fStack_278 = fStack_618 * auVar105._8_4_ * 3.0;
    auVar19._8_4_ = fStack_278;
    fStack_274 = fStack_614 * auVar105._12_4_ * 3.0;
    auVar19._12_4_ = fStack_274;
    fStack_270 = local_620 * auVar105._16_4_ * 3.0;
    auVar19._16_4_ = fStack_270;
    fStack_26c = fStack_61c * auVar105._20_4_ * 3.0;
    auVar19._20_4_ = fStack_26c;
    fStack_268 = fStack_618 * auVar105._24_4_ * 3.0;
    auVar19._24_4_ = fStack_268;
    auVar19._28_4_ = fVar341;
    auVar18 = vsubps_avx(local_220,auVar18);
    auVar105 = vperm2f128_avx(auVar18,auVar18,1);
    auVar105 = vshufps_avx(auVar105,auVar18,0x30);
    auVar105 = vshufps_avx(auVar18,auVar105,0x29);
    auVar19 = vsubps_avx(auVar192,auVar19);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar18,0x29);
    fVar339 = auVar159._0_4_;
    fVar340 = auVar159._4_4_;
    fVar363 = auVar159._8_4_;
    fVar226 = auVar207._12_4_;
    fVar223 = auVar129._0_4_;
    fVar228 = auVar129._4_4_;
    fVar327 = auVar129._8_4_;
    fVar335 = auVar129._12_4_;
    auVar93 = vshufps_avx(auVar269,auVar269,0xaa);
    fVar193 = auVar93._0_4_;
    fVar197 = auVar93._4_4_;
    fVar221 = auVar93._8_4_;
    fVar229 = auVar93._12_4_;
    fVar244 = auVar319._0_4_ * fVar193 + fVar339 * fVar292;
    fVar227 = auVar319._4_4_ * fVar197 + fVar340 * fVar303;
    fVar115 = auVar319._8_4_ * fVar221 + fVar363 * fVar304;
    fVar116 = auVar319._12_4_ * fVar229 + auVar159._12_4_ * fVar305;
    fVar117 = auVar319._16_4_ * fVar193 + fVar339 * fVar306;
    fVar199 = auVar319._20_4_ * fVar197 + fVar340 * fVar307;
    fVar245 = auVar319._24_4_ * fVar221 + fVar363 * fVar308;
    auVar93 = vshufps_avx(auVar269,auVar269,0xff);
    fVar195 = auVar93._0_4_;
    fVar200 = auVar93._4_4_;
    fVar224 = auVar93._8_4_;
    fVar242 = auVar93._12_4_;
    fVar273 = auVar319._0_4_ * fVar195 + fVar223 * fVar292;
    fVar288 = auVar319._4_4_ * fVar200 + fVar228 * fVar303;
    fVar289 = auVar319._8_4_ * fVar224 + fVar327 * fVar304;
    fVar290 = auVar319._12_4_ * fVar242 + fVar335 * fVar305;
    fVar336 = auVar319._16_4_ * fVar195 + fVar223 * fVar306;
    fVar291 = auVar319._20_4_ * fVar200 + fVar228 * fVar307;
    fVar337 = auVar319._24_4_ * fVar224 + fVar327 * fVar308;
    auVar93 = vshufps_avx(auVar208,auVar208,0xaa);
    fVar338 = auVar93._12_4_ + fVar229;
    auVar173 = vshufps_avx(auVar208,auVar208,0xff);
    fVar243 = auVar173._12_4_;
    auVar108._0_4_ =
         fVar292 * (fVar339 * auVar319._0_4_ + fVar292 * auVar207._0_4_) + auVar319._0_4_ * fVar244;
    auVar108._4_4_ =
         fVar303 * (fVar340 * auVar319._4_4_ + fVar303 * auVar207._4_4_) + auVar319._4_4_ * fVar227;
    auVar108._8_4_ =
         fVar304 * (fVar363 * auVar319._8_4_ + fVar304 * auVar207._8_4_) + auVar319._8_4_ * fVar115;
    auVar108._12_4_ =
         fVar305 * (auVar159._12_4_ * auVar319._12_4_ + fVar305 * fVar226) +
         auVar319._12_4_ * fVar116;
    auVar108._16_4_ =
         fVar306 * (fVar339 * auVar319._16_4_ + fVar306 * auVar207._0_4_) +
         auVar319._16_4_ * fVar117;
    auVar108._20_4_ =
         fVar307 * (fVar340 * auVar319._20_4_ + fVar307 * auVar207._4_4_) +
         auVar319._20_4_ * fVar199;
    auVar108._24_4_ =
         fVar308 * (fVar363 * auVar319._24_4_ + fVar308 * auVar207._8_4_) +
         auVar319._24_4_ * fVar245;
    auVar108._28_4_ = auVar19._28_4_ + fVar226 + fVar243;
    auVar143._0_4_ =
         fVar292 * (fVar223 * auVar319._0_4_ + auVar128._0_4_ * fVar292) + auVar319._0_4_ * fVar273;
    auVar143._4_4_ =
         fVar303 * (fVar228 * auVar319._4_4_ + auVar128._4_4_ * fVar303) + auVar319._4_4_ * fVar288;
    auVar143._8_4_ =
         fVar304 * (fVar327 * auVar319._8_4_ + auVar128._8_4_ * fVar304) + auVar319._8_4_ * fVar289;
    auVar143._12_4_ =
         fVar305 * (fVar335 * auVar319._12_4_ + auVar128._12_4_ * fVar305) +
         auVar319._12_4_ * fVar290;
    auVar143._16_4_ =
         fVar306 * (fVar223 * auVar319._16_4_ + auVar128._0_4_ * fVar306) +
         auVar319._16_4_ * fVar336;
    auVar143._20_4_ =
         fVar307 * (fVar228 * auVar319._20_4_ + auVar128._4_4_ * fVar307) +
         auVar319._20_4_ * fVar291;
    auVar143._24_4_ =
         fVar308 * (fVar327 * auVar319._24_4_ + auVar128._8_4_ * fVar308) +
         auVar319._24_4_ * fVar337;
    auVar143._28_4_ = fVar226 + auVar18._28_4_ + fVar243;
    auVar18 = vperm2f128_avx(local_220,local_220,1);
    auVar18 = vshufps_avx(auVar18,local_220,0x30);
    auVar106 = vshufps_avx(local_220,auVar18,0x29);
    auVar241._0_4_ =
         auVar319._0_4_ * (auVar93._0_4_ * auVar319._0_4_ + fVar292 * fVar193) + fVar292 * fVar244;
    auVar241._4_4_ =
         auVar319._4_4_ * (auVar93._4_4_ * auVar319._4_4_ + fVar303 * fVar197) + fVar303 * fVar227;
    auVar241._8_4_ =
         auVar319._8_4_ * (auVar93._8_4_ * auVar319._8_4_ + fVar304 * fVar221) + fVar304 * fVar115;
    auVar241._12_4_ =
         auVar319._12_4_ * (auVar93._12_4_ * auVar319._12_4_ + fVar305 * fVar229) +
         fVar305 * fVar116;
    auVar241._16_4_ =
         auVar319._16_4_ * (auVar93._0_4_ * auVar319._16_4_ + fVar306 * fVar193) + fVar306 * fVar117
    ;
    auVar241._20_4_ =
         auVar319._20_4_ * (auVar93._4_4_ * auVar319._20_4_ + fVar307 * fVar197) + fVar307 * fVar199
    ;
    auVar241._24_4_ =
         auVar319._24_4_ * (auVar93._8_4_ * auVar319._24_4_ + fVar308 * fVar221) + fVar308 * fVar245
    ;
    auVar241._28_4_ = fVar338 + fVar346 + auVar240._28_4_;
    auVar287._0_4_ =
         fVar292 * fVar273 + auVar319._0_4_ * (auVar319._0_4_ * auVar173._0_4_ + fVar292 * fVar195);
    auVar287._4_4_ =
         fVar303 * fVar288 + auVar319._4_4_ * (auVar319._4_4_ * auVar173._4_4_ + fVar303 * fVar200);
    auVar287._8_4_ =
         fVar304 * fVar289 + auVar319._8_4_ * (auVar319._8_4_ * auVar173._8_4_ + fVar304 * fVar224);
    auVar287._12_4_ =
         fVar305 * fVar290 + auVar319._12_4_ * (auVar319._12_4_ * fVar243 + fVar305 * fVar242);
    auVar287._16_4_ =
         fVar306 * fVar336 +
         auVar319._16_4_ * (auVar319._16_4_ * auVar173._0_4_ + fVar306 * fVar195);
    auVar287._20_4_ =
         fVar307 * fVar291 +
         auVar319._20_4_ * (auVar319._20_4_ * auVar173._4_4_ + fVar307 * fVar200);
    auVar287._24_4_ =
         fVar308 * fVar337 +
         auVar319._24_4_ * (auVar319._24_4_ * auVar173._8_4_ + fVar308 * fVar224);
    auVar287._28_4_ = fVar346 + fVar335 + fVar243 + fVar242;
    auVar272._0_4_ = fVar292 * auVar108._0_4_ + auVar319._0_4_ * auVar241._0_4_;
    auVar272._4_4_ = fVar303 * auVar108._4_4_ + auVar319._4_4_ * auVar241._4_4_;
    auVar272._8_4_ = fVar304 * auVar108._8_4_ + auVar319._8_4_ * auVar241._8_4_;
    auVar272._12_4_ = fVar305 * auVar108._12_4_ + auVar319._12_4_ * auVar241._12_4_;
    auVar272._16_4_ = fVar306 * auVar108._16_4_ + auVar319._16_4_ * auVar241._16_4_;
    auVar272._20_4_ = fVar307 * auVar108._20_4_ + auVar319._20_4_ * auVar241._20_4_;
    auVar272._24_4_ = fVar308 * auVar108._24_4_ + auVar319._24_4_ * auVar241._24_4_;
    auVar272._28_4_ = fVar338 + fVar243 + fVar242;
    auVar302._0_4_ = fVar292 * auVar143._0_4_ + auVar319._0_4_ * auVar287._0_4_;
    auVar302._4_4_ = fVar303 * auVar143._4_4_ + auVar319._4_4_ * auVar287._4_4_;
    auVar302._8_4_ = fVar304 * auVar143._8_4_ + auVar319._8_4_ * auVar287._8_4_;
    auVar302._12_4_ = fVar305 * auVar143._12_4_ + auVar319._12_4_ * auVar287._12_4_;
    auVar302._16_4_ = fVar306 * auVar143._16_4_ + auVar319._16_4_ * auVar287._16_4_;
    auVar302._20_4_ = fVar307 * auVar143._20_4_ + auVar319._20_4_ * auVar287._20_4_;
    auVar302._24_4_ = fVar308 * auVar143._24_4_ + auVar319._24_4_ * auVar287._24_4_;
    auVar302._28_4_ = auVar16._28_4_ + auVar319._28_4_;
    auVar20 = vsubps_avx(auVar241,auVar108);
    auVar18 = vsubps_avx(auVar287,auVar143);
    local_2a0 = local_620 * auVar20._0_4_ * 3.0;
    fStack_29c = fStack_61c * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_29c;
    auVar16._0_4_ = local_2a0;
    fStack_298 = fStack_618 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_298;
    fStack_294 = fStack_614 * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_294;
    fStack_290 = local_620 * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_290;
    fStack_28c = fStack_61c * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_28c;
    fStack_288 = fStack_618 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_288;
    auVar16._28_4_ = auVar20._28_4_;
    local_2c0 = local_620 * auVar18._0_4_ * 3.0;
    fStack_2bc = fStack_61c * auVar18._4_4_ * 3.0;
    auVar21._4_4_ = fStack_2bc;
    auVar21._0_4_ = local_2c0;
    fStack_2b8 = fStack_618 * auVar18._8_4_ * 3.0;
    auVar21._8_4_ = fStack_2b8;
    fStack_2b4 = fStack_614 * auVar18._12_4_ * 3.0;
    auVar21._12_4_ = fStack_2b4;
    fStack_2b0 = local_620 * auVar18._16_4_ * 3.0;
    auVar21._16_4_ = fStack_2b0;
    fStack_2ac = fStack_61c * auVar18._20_4_ * 3.0;
    auVar21._20_4_ = fStack_2ac;
    fStack_2a8 = fStack_618 * auVar18._24_4_ * 3.0;
    auVar21._24_4_ = fStack_2a8;
    auVar21._28_4_ = auVar241._28_4_;
    auVar18 = vperm2f128_avx(auVar272,auVar272,1);
    auVar18 = vshufps_avx(auVar18,auVar272,0x30);
    auVar107 = vshufps_avx(auVar272,auVar18,0x29);
    auVar16 = vsubps_avx(auVar272,auVar16);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar18 = vshufps_avx(auVar16,auVar18,0x29);
    auVar21 = vsubps_avx(auVar302,auVar21);
    auVar16 = vperm2f128_avx(auVar21,auVar21,1);
    auVar16 = vshufps_avx(auVar16,auVar21,0x30);
    local_200 = vshufps_avx(auVar21,auVar16,0x29);
    auVar22 = vsubps_avx(auVar272,local_220);
    auVar108 = vsubps_avx(auVar107,auVar106);
    fVar193 = auVar108._0_4_ + auVar22._0_4_;
    fVar195 = auVar108._4_4_ + auVar22._4_4_;
    fVar197 = auVar108._8_4_ + auVar22._8_4_;
    fVar200 = auVar108._12_4_ + auVar22._12_4_;
    fVar221 = auVar108._16_4_ + auVar22._16_4_;
    fVar224 = auVar108._20_4_ + auVar22._20_4_;
    fVar226 = auVar108._24_4_ + auVar22._24_4_;
    auVar16 = vperm2f128_avx(auVar192,auVar192,1);
    auVar16 = vshufps_avx(auVar16,auVar192,0x30);
    local_240 = vshufps_avx(auVar192,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar302,auVar302,1);
    auVar16 = vshufps_avx(auVar16,auVar302,0x30);
    auVar21 = vshufps_avx(auVar302,auVar16,0x29);
    auVar16 = vsubps_avx(auVar302,auVar192);
    auVar143 = vsubps_avx(auVar21,local_240);
    fVar229 = auVar143._0_4_ + auVar16._0_4_;
    fVar242 = auVar143._4_4_ + auVar16._4_4_;
    fVar243 = auVar143._8_4_ + auVar16._8_4_;
    fVar244 = auVar143._12_4_ + auVar16._12_4_;
    fVar227 = auVar143._16_4_ + auVar16._16_4_;
    fVar115 = auVar143._20_4_ + auVar16._20_4_;
    fVar116 = auVar143._24_4_ + auVar16._24_4_;
    auVar23._4_4_ = fVar195 * auVar192._4_4_;
    auVar23._0_4_ = fVar193 * auVar192._0_4_;
    auVar23._8_4_ = fVar197 * auVar192._8_4_;
    auVar23._12_4_ = fVar200 * auVar192._12_4_;
    auVar23._16_4_ = fVar221 * auVar192._16_4_;
    auVar23._20_4_ = fVar224 * auVar192._20_4_;
    auVar23._24_4_ = fVar226 * auVar192._24_4_;
    auVar23._28_4_ = auVar16._28_4_;
    auVar24._4_4_ = fVar242 * local_220._4_4_;
    auVar24._0_4_ = fVar229 * local_220._0_4_;
    auVar24._8_4_ = fVar243 * local_220._8_4_;
    auVar24._12_4_ = fVar244 * local_220._12_4_;
    auVar24._16_4_ = fVar227 * local_220._16_4_;
    auVar24._20_4_ = fVar115 * local_220._20_4_;
    auVar24._24_4_ = fVar116 * local_220._24_4_;
    auVar24._28_4_ = fVar338;
    auVar23 = vsubps_avx(auVar23,auVar24);
    local_260 = local_220._0_4_ + local_260;
    fStack_25c = local_220._4_4_ + fStack_25c;
    fStack_258 = local_220._8_4_ + fStack_258;
    fStack_254 = local_220._12_4_ + fStack_254;
    fStack_250 = local_220._16_4_ + fStack_250;
    fStack_24c = local_220._20_4_ + fStack_24c;
    fStack_248 = local_220._24_4_ + fStack_248;
    fStack_244 = local_220._28_4_ + auVar17._28_4_;
    local_280 = local_280 + auVar192._0_4_;
    fStack_27c = fStack_27c + auVar192._4_4_;
    fStack_278 = fStack_278 + auVar192._8_4_;
    fStack_274 = fStack_274 + auVar192._12_4_;
    fStack_270 = fStack_270 + auVar192._16_4_;
    fStack_26c = fStack_26c + auVar192._20_4_;
    fStack_268 = fStack_268 + auVar192._24_4_;
    fStack_264 = fVar341 + auVar192._28_4_;
    auVar17._4_4_ = fVar195 * fStack_27c;
    auVar17._0_4_ = fVar193 * local_280;
    auVar17._8_4_ = fVar197 * fStack_278;
    auVar17._12_4_ = fVar200 * fStack_274;
    auVar17._16_4_ = fVar221 * fStack_270;
    auVar17._20_4_ = fVar224 * fStack_26c;
    auVar17._24_4_ = fVar226 * fStack_268;
    auVar17._28_4_ = fVar341;
    auVar25._4_4_ = fVar242 * fStack_25c;
    auVar25._0_4_ = fVar229 * local_260;
    auVar25._8_4_ = fVar243 * fStack_258;
    auVar25._12_4_ = fVar244 * fStack_254;
    auVar25._16_4_ = fVar227 * fStack_250;
    auVar25._20_4_ = fVar115 * fStack_24c;
    auVar25._24_4_ = fVar116 * fStack_248;
    auVar25._28_4_ = fVar341 + auVar192._28_4_;
    auVar17 = vsubps_avx(auVar17,auVar25);
    local_6a0 = auVar19._0_4_;
    fStack_69c = auVar19._4_4_;
    fStack_698 = auVar19._8_4_;
    fStack_694 = auVar19._12_4_;
    fStack_690 = auVar19._16_4_;
    fStack_68c = auVar19._20_4_;
    fStack_688 = auVar19._24_4_;
    auVar26._4_4_ = fVar195 * fStack_69c;
    auVar26._0_4_ = fVar193 * local_6a0;
    auVar26._8_4_ = fVar197 * fStack_698;
    auVar26._12_4_ = fVar200 * fStack_694;
    auVar26._16_4_ = fVar221 * fStack_690;
    auVar26._20_4_ = fVar224 * fStack_68c;
    auVar26._24_4_ = fVar226 * fStack_688;
    auVar26._28_4_ = fVar341;
    local_700._0_4_ = auVar105._0_4_;
    local_700._4_4_ = auVar105._4_4_;
    fStack_6f8 = auVar105._8_4_;
    fStack_6f4 = auVar105._12_4_;
    fStack_6f0 = auVar105._16_4_;
    fStack_6ec = auVar105._20_4_;
    fStack_6e8 = auVar105._24_4_;
    auVar27._4_4_ = fVar242 * (float)local_700._4_4_;
    auVar27._0_4_ = fVar229 * (float)local_700._0_4_;
    auVar27._8_4_ = fVar243 * fStack_6f8;
    auVar27._12_4_ = fVar244 * fStack_6f4;
    auVar27._16_4_ = fVar227 * fStack_6f0;
    auVar27._20_4_ = fVar115 * fStack_6ec;
    auVar27._24_4_ = fVar116 * fStack_6e8;
    auVar27._28_4_ = local_220._28_4_;
    auVar24 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = local_240._4_4_ * fVar195;
    auVar28._0_4_ = local_240._0_4_ * fVar193;
    auVar28._8_4_ = local_240._8_4_ * fVar197;
    auVar28._12_4_ = local_240._12_4_ * fVar200;
    auVar28._16_4_ = local_240._16_4_ * fVar221;
    auVar28._20_4_ = local_240._20_4_ * fVar224;
    auVar28._24_4_ = local_240._24_4_ * fVar226;
    auVar28._28_4_ = fVar341;
    auVar29._4_4_ = auVar106._4_4_ * fVar242;
    auVar29._0_4_ = auVar106._0_4_ * fVar229;
    auVar29._8_4_ = auVar106._8_4_ * fVar243;
    auVar29._12_4_ = auVar106._12_4_ * fVar244;
    auVar29._16_4_ = auVar106._16_4_ * fVar227;
    auVar29._20_4_ = auVar106._20_4_ * fVar115;
    auVar29._24_4_ = auVar106._24_4_ * fVar116;
    auVar29._28_4_ = local_240._28_4_;
    local_620 = auVar18._0_4_;
    fStack_61c = auVar18._4_4_;
    fStack_618 = auVar18._8_4_;
    fStack_614 = auVar18._12_4_;
    fStack_610 = auVar18._16_4_;
    fStack_60c = auVar18._20_4_;
    fStack_608 = auVar18._24_4_;
    auVar25 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = auVar302._4_4_ * fVar195;
    auVar30._0_4_ = auVar302._0_4_ * fVar193;
    auVar30._8_4_ = auVar302._8_4_ * fVar197;
    auVar30._12_4_ = auVar302._12_4_ * fVar200;
    auVar30._16_4_ = auVar302._16_4_ * fVar221;
    auVar30._20_4_ = auVar302._20_4_ * fVar224;
    auVar30._24_4_ = auVar302._24_4_ * fVar226;
    auVar30._28_4_ = fVar341;
    auVar31._4_4_ = fVar242 * auVar272._4_4_;
    auVar31._0_4_ = fVar229 * auVar272._0_4_;
    auVar31._8_4_ = fVar243 * auVar272._8_4_;
    auVar31._12_4_ = fVar244 * auVar272._12_4_;
    auVar31._16_4_ = fVar227 * auVar272._16_4_;
    auVar31._20_4_ = fVar115 * auVar272._20_4_;
    auVar31._24_4_ = fVar116 * auVar272._24_4_;
    auVar31._28_4_ = fStack_244;
    auVar26 = vsubps_avx(auVar30,auVar31);
    local_2a0 = auVar272._0_4_ + local_2a0;
    fStack_29c = auVar272._4_4_ + fStack_29c;
    fStack_298 = auVar272._8_4_ + fStack_298;
    fStack_294 = auVar272._12_4_ + fStack_294;
    fStack_290 = auVar272._16_4_ + fStack_290;
    fStack_28c = auVar272._20_4_ + fStack_28c;
    fStack_288 = auVar272._24_4_ + fStack_288;
    fStack_284 = auVar272._28_4_ + auVar20._28_4_;
    local_2c0 = auVar302._0_4_ + local_2c0;
    fStack_2bc = auVar302._4_4_ + fStack_2bc;
    fStack_2b8 = auVar302._8_4_ + fStack_2b8;
    fStack_2b4 = auVar302._12_4_ + fStack_2b4;
    fStack_2b0 = auVar302._16_4_ + fStack_2b0;
    fStack_2ac = auVar302._20_4_ + fStack_2ac;
    fStack_2a8 = auVar302._24_4_ + fStack_2a8;
    fStack_2a4 = auVar302._28_4_ + auVar241._28_4_;
    auVar20._4_4_ = fVar195 * fStack_2bc;
    auVar20._0_4_ = fVar193 * local_2c0;
    auVar20._8_4_ = fVar197 * fStack_2b8;
    auVar20._12_4_ = fVar200 * fStack_2b4;
    auVar20._16_4_ = fVar221 * fStack_2b0;
    auVar20._20_4_ = fVar224 * fStack_2ac;
    auVar20._24_4_ = fVar226 * fStack_2a8;
    auVar20._28_4_ = auVar302._28_4_ + auVar241._28_4_;
    auVar32._4_4_ = fStack_29c * fVar242;
    auVar32._0_4_ = local_2a0 * fVar229;
    auVar32._8_4_ = fStack_298 * fVar243;
    auVar32._12_4_ = fStack_294 * fVar244;
    auVar32._16_4_ = fStack_290 * fVar227;
    auVar32._20_4_ = fStack_28c * fVar115;
    auVar32._24_4_ = fStack_288 * fVar116;
    auVar32._28_4_ = fStack_284;
    auVar20 = vsubps_avx(auVar20,auVar32);
    auVar33._4_4_ = fVar195 * local_200._4_4_;
    auVar33._0_4_ = fVar193 * local_200._0_4_;
    auVar33._8_4_ = fVar197 * local_200._8_4_;
    auVar33._12_4_ = fVar200 * local_200._12_4_;
    auVar33._16_4_ = fVar221 * local_200._16_4_;
    auVar33._20_4_ = fVar224 * local_200._20_4_;
    auVar33._24_4_ = fVar226 * local_200._24_4_;
    auVar33._28_4_ = fStack_284;
    auVar34._4_4_ = fVar242 * fStack_61c;
    auVar34._0_4_ = fVar229 * local_620;
    auVar34._8_4_ = fVar243 * fStack_618;
    auVar34._12_4_ = fVar244 * fStack_614;
    auVar34._16_4_ = fVar227 * fStack_610;
    auVar34._20_4_ = fVar115 * fStack_60c;
    auVar34._24_4_ = fVar116 * fStack_608;
    auVar34._28_4_ = local_200._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = fVar195 * auVar21._4_4_;
    auVar35._0_4_ = fVar193 * auVar21._0_4_;
    auVar35._8_4_ = fVar197 * auVar21._8_4_;
    auVar35._12_4_ = fVar200 * auVar21._12_4_;
    auVar35._16_4_ = fVar221 * auVar21._16_4_;
    auVar35._20_4_ = fVar224 * auVar21._20_4_;
    auVar35._24_4_ = fVar226 * auVar21._24_4_;
    auVar35._28_4_ = auVar108._28_4_ + auVar22._28_4_;
    auVar22._4_4_ = auVar107._4_4_ * fVar242;
    auVar22._0_4_ = auVar107._0_4_ * fVar229;
    auVar22._8_4_ = auVar107._8_4_ * fVar243;
    auVar22._12_4_ = auVar107._12_4_ * fVar244;
    auVar22._16_4_ = auVar107._16_4_ * fVar227;
    auVar22._20_4_ = auVar107._20_4_ * fVar115;
    auVar22._24_4_ = auVar107._24_4_ * fVar116;
    auVar22._28_4_ = auVar143._28_4_ + auVar16._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar18 = vminps_avx(auVar23,auVar17);
    auVar105 = vmaxps_avx(auVar23,auVar17);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar24,auVar25);
    auVar105 = vmaxps_avx(auVar105,auVar18);
    auVar16 = vminps_avx(auVar26,auVar20);
    auVar18 = vmaxps_avx(auVar26,auVar20);
    auVar17 = vminps_avx(auVar27,auVar22);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar17 = vminps_avx(auVar19,auVar17);
    auVar19 = vmaxps_avx(auVar27,auVar22);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar105,auVar18);
    auVar105 = vcmpps_avx(auVar17,local_1c0,2);
    auVar18 = vcmpps_avx(auVar18,local_1e0,5);
    auVar105 = vandps_avx(auVar18,auVar105);
    auVar18 = local_2e0 & auVar105;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(auVar106,local_220);
      auVar19 = vsubps_avx(auVar107,auVar272);
      fVar195 = auVar18._0_4_ + auVar19._0_4_;
      fVar197 = auVar18._4_4_ + auVar19._4_4_;
      fVar200 = auVar18._8_4_ + auVar19._8_4_;
      fVar221 = auVar18._12_4_ + auVar19._12_4_;
      fVar224 = auVar18._16_4_ + auVar19._16_4_;
      fVar226 = auVar18._20_4_ + auVar19._20_4_;
      fVar229 = auVar18._24_4_ + auVar19._24_4_;
      auVar17 = vsubps_avx(local_240,auVar192);
      auVar20 = vsubps_avx(auVar21,auVar302);
      fVar242 = auVar17._0_4_ + auVar20._0_4_;
      fVar243 = auVar17._4_4_ + auVar20._4_4_;
      fVar244 = auVar17._8_4_ + auVar20._8_4_;
      fVar227 = auVar17._12_4_ + auVar20._12_4_;
      fVar115 = auVar17._16_4_ + auVar20._16_4_;
      fVar116 = auVar17._20_4_ + auVar20._20_4_;
      fVar117 = auVar17._24_4_ + auVar20._24_4_;
      fVar193 = auVar20._28_4_;
      auVar36._4_4_ = auVar192._4_4_ * fVar197;
      auVar36._0_4_ = auVar192._0_4_ * fVar195;
      auVar36._8_4_ = auVar192._8_4_ * fVar200;
      auVar36._12_4_ = auVar192._12_4_ * fVar221;
      auVar36._16_4_ = auVar192._16_4_ * fVar224;
      auVar36._20_4_ = auVar192._20_4_ * fVar226;
      auVar36._24_4_ = auVar192._24_4_ * fVar229;
      auVar36._28_4_ = auVar192._28_4_;
      auVar37._4_4_ = local_220._4_4_ * fVar243;
      auVar37._0_4_ = local_220._0_4_ * fVar242;
      auVar37._8_4_ = local_220._8_4_ * fVar244;
      auVar37._12_4_ = local_220._12_4_ * fVar227;
      auVar37._16_4_ = local_220._16_4_ * fVar115;
      auVar37._20_4_ = local_220._20_4_ * fVar116;
      auVar37._24_4_ = local_220._24_4_ * fVar117;
      auVar37._28_4_ = local_220._28_4_;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar197 * fStack_27c;
      auVar38._0_4_ = fVar195 * local_280;
      auVar38._8_4_ = fVar200 * fStack_278;
      auVar38._12_4_ = fVar221 * fStack_274;
      auVar38._16_4_ = fVar224 * fStack_270;
      auVar38._20_4_ = fVar226 * fStack_26c;
      auVar38._24_4_ = fVar229 * fStack_268;
      auVar38._28_4_ = auVar192._28_4_;
      auVar39._4_4_ = fVar243 * fStack_25c;
      auVar39._0_4_ = fVar242 * local_260;
      auVar39._8_4_ = fVar244 * fStack_258;
      auVar39._12_4_ = fVar227 * fStack_254;
      auVar39._16_4_ = fVar115 * fStack_250;
      auVar39._20_4_ = fVar116 * fStack_24c;
      auVar39._24_4_ = fVar117 * fStack_248;
      auVar39._28_4_ = fVar193;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar197 * fStack_69c;
      auVar40._0_4_ = fVar195 * local_6a0;
      auVar40._8_4_ = fVar200 * fStack_698;
      auVar40._12_4_ = fVar221 * fStack_694;
      auVar40._16_4_ = fVar224 * fStack_690;
      auVar40._20_4_ = fVar226 * fStack_68c;
      auVar40._24_4_ = fVar229 * fStack_688;
      auVar40._28_4_ = fVar193;
      auVar41._4_4_ = fVar243 * (float)local_700._4_4_;
      auVar41._0_4_ = fVar242 * (float)local_700._0_4_;
      auVar41._8_4_ = fVar244 * fStack_6f8;
      auVar41._12_4_ = fVar227 * fStack_6f4;
      auVar41._16_4_ = fVar115 * fStack_6f0;
      auVar41._20_4_ = fVar116 * fStack_6ec;
      auVar41._24_4_ = fVar117 * fStack_6e8;
      auVar41._28_4_ = auVar16._28_4_;
      auVar108 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_240._4_4_ * fVar197;
      auVar42._0_4_ = local_240._0_4_ * fVar195;
      auVar42._8_4_ = local_240._8_4_ * fVar200;
      auVar42._12_4_ = local_240._12_4_ * fVar221;
      auVar42._16_4_ = local_240._16_4_ * fVar224;
      auVar42._20_4_ = local_240._20_4_ * fVar226;
      auVar42._24_4_ = local_240._24_4_ * fVar229;
      auVar42._28_4_ = auVar16._28_4_;
      auVar43._4_4_ = auVar106._4_4_ * fVar243;
      auVar43._0_4_ = auVar106._0_4_ * fVar242;
      auVar43._8_4_ = auVar106._8_4_ * fVar244;
      auVar43._12_4_ = auVar106._12_4_ * fVar227;
      auVar43._16_4_ = auVar106._16_4_ * fVar115;
      auVar43._20_4_ = auVar106._20_4_ * fVar116;
      uVar73 = auVar106._28_4_;
      auVar43._24_4_ = auVar106._24_4_ * fVar117;
      auVar43._28_4_ = uVar73;
      auVar106 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar302._4_4_ * fVar197;
      auVar44._0_4_ = auVar302._0_4_ * fVar195;
      auVar44._8_4_ = auVar302._8_4_ * fVar200;
      auVar44._12_4_ = auVar302._12_4_ * fVar221;
      auVar44._16_4_ = auVar302._16_4_ * fVar224;
      auVar44._20_4_ = auVar302._20_4_ * fVar226;
      auVar44._24_4_ = auVar302._24_4_ * fVar229;
      auVar44._28_4_ = uVar73;
      auVar45._4_4_ = auVar272._4_4_ * fVar243;
      auVar45._0_4_ = auVar272._0_4_ * fVar242;
      auVar45._8_4_ = auVar272._8_4_ * fVar244;
      auVar45._12_4_ = auVar272._12_4_ * fVar227;
      auVar45._16_4_ = auVar272._16_4_ * fVar115;
      auVar45._20_4_ = auVar272._20_4_ * fVar116;
      auVar45._24_4_ = auVar272._24_4_ * fVar117;
      auVar45._28_4_ = auVar272._28_4_;
      auVar143 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar197 * fStack_2bc;
      auVar46._0_4_ = fVar195 * local_2c0;
      auVar46._8_4_ = fVar200 * fStack_2b8;
      auVar46._12_4_ = fVar221 * fStack_2b4;
      auVar46._16_4_ = fVar224 * fStack_2b0;
      auVar46._20_4_ = fVar226 * fStack_2ac;
      auVar46._24_4_ = fVar229 * fStack_2a8;
      auVar46._28_4_ = uVar73;
      auVar47._4_4_ = fVar243 * fStack_29c;
      auVar47._0_4_ = fVar242 * local_2a0;
      auVar47._8_4_ = fVar244 * fStack_298;
      auVar47._12_4_ = fVar227 * fStack_294;
      auVar47._16_4_ = fVar115 * fStack_290;
      auVar47._20_4_ = fVar116 * fStack_28c;
      auVar47._24_4_ = fVar117 * fStack_288;
      auVar47._28_4_ = auVar302._28_4_;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar197 * local_200._4_4_;
      auVar48._0_4_ = fVar195 * local_200._0_4_;
      auVar48._8_4_ = fVar200 * local_200._8_4_;
      auVar48._12_4_ = fVar221 * local_200._12_4_;
      auVar48._16_4_ = fVar224 * local_200._16_4_;
      auVar48._20_4_ = fVar226 * local_200._20_4_;
      auVar48._24_4_ = fVar229 * local_200._24_4_;
      auVar48._28_4_ = auVar302._28_4_;
      auVar49._4_4_ = fStack_61c * fVar243;
      auVar49._0_4_ = local_620 * fVar242;
      auVar49._8_4_ = fStack_618 * fVar244;
      auVar49._12_4_ = fStack_614 * fVar227;
      auVar49._16_4_ = fStack_610 * fVar115;
      auVar49._20_4_ = fStack_60c * fVar116;
      auVar49._24_4_ = fStack_608 * fVar117;
      auVar49._28_4_ = local_240._28_4_;
      auVar24 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar197 * auVar21._4_4_;
      auVar50._0_4_ = fVar195 * auVar21._0_4_;
      auVar50._8_4_ = fVar200 * auVar21._8_4_;
      auVar50._12_4_ = fVar221 * auVar21._12_4_;
      auVar50._16_4_ = fVar224 * auVar21._16_4_;
      auVar50._20_4_ = fVar226 * auVar21._20_4_;
      auVar50._24_4_ = fVar229 * auVar21._24_4_;
      auVar50._28_4_ = auVar18._28_4_ + auVar19._28_4_;
      auVar51._4_4_ = auVar107._4_4_ * fVar243;
      auVar51._0_4_ = auVar107._0_4_ * fVar242;
      auVar51._8_4_ = auVar107._8_4_ * fVar244;
      auVar51._12_4_ = auVar107._12_4_ * fVar227;
      auVar51._16_4_ = auVar107._16_4_ * fVar115;
      auVar51._20_4_ = auVar107._20_4_ * fVar116;
      auVar51._24_4_ = auVar107._24_4_ * fVar117;
      auVar51._28_4_ = auVar17._28_4_ + fVar193;
      auVar107 = vsubps_avx(auVar50,auVar51);
      auVar19 = vminps_avx(auVar20,auVar22);
      auVar18 = vmaxps_avx(auVar20,auVar22);
      auVar16 = vminps_avx(auVar108,auVar106);
      auVar16 = vminps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar108,auVar106);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar17 = vminps_avx(auVar143,auVar23);
      auVar19 = vmaxps_avx(auVar143,auVar23);
      auVar106 = vminps_avx(auVar24,auVar107);
      auVar17 = vminps_avx(auVar17,auVar106);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar24,auVar107);
      auVar19 = vmaxps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vcmpps_avx(auVar17,local_1c0,2);
      auVar19 = vcmpps_avx(auVar19,local_1e0,5);
      auVar18 = vandps_avx(auVar19,auVar18);
      auVar105 = vandps_avx(local_2e0,auVar105);
      auVar19 = auVar105 & auVar18;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar18,auVar105);
        uVar63 = vmovmskps_avx(auVar105);
        if (uVar63 != 0) {
          auStack_480[uVar66] = uVar63 & 0xff;
          uVar4 = vmovlps_avx(local_420);
          *(undefined8 *)(afStack_340 + uVar66 * 2) = uVar4;
          uVar5 = vmovlps_avx(auVar119);
          auStack_1a0[uVar66] = uVar5;
          uVar66 = (ulong)((int)uVar66 + 1);
        }
      }
    }
LAB_0094e41e:
    do {
      do {
        do {
          do {
            if ((int)uVar66 == 0) {
              uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar104._4_4_ = uVar73;
              auVar104._0_4_ = uVar73;
              auVar104._8_4_ = uVar73;
              auVar104._12_4_ = uVar73;
              auVar93 = vcmpps_avx(local_470,auVar104,2);
              uVar64 = vmovmskps_avx(auVar93);
              uVar65 = (ulong)((uint)uVar65 & (uint)uVar65 + 0xf & uVar64);
              auVar53 = ZEXT812(0) << 0x20;
              goto LAB_0094d112;
            }
            uVar67 = (int)uVar66 - 1;
            uVar69 = (ulong)uVar67;
            uVar63 = auStack_480[uVar69];
            fVar193 = afStack_340[uVar69 * 2];
            fVar195 = afStack_340[uVar69 * 2 + 1];
            auVar352._8_8_ = 0;
            auVar352._0_8_ = auStack_1a0[uVar69];
            auVar356 = ZEXT1664(auVar352);
            uVar5 = 0;
            if (uVar63 != 0) {
              for (; (uVar63 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            uVar63 = uVar63 - 1 & uVar63;
            auStack_480[uVar69] = uVar63;
            if (uVar63 == 0) {
              uVar66 = (ulong)uVar67;
            }
            fVar200 = (float)(uVar5 + 1) * 0.14285715;
            fVar197 = (1.0 - (float)uVar5 * 0.14285715) * fVar193 +
                      fVar195 * (float)uVar5 * 0.14285715;
            fVar193 = (1.0 - fVar200) * fVar193 + fVar195 * fVar200;
            fVar195 = fVar193 - fVar197;
            if (0.16666667 <= fVar195) {
              auVar93 = vinsertps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar193),0x10);
              auVar362 = ZEXT1664(auVar93);
              goto LAB_0094ddaf;
            }
            auVar93 = vshufps_avx(auVar352,auVar352,0x50);
            auVar126._8_4_ = 0x3f800000;
            auVar126._0_8_ = 0x3f8000003f800000;
            auVar126._12_4_ = 0x3f800000;
            auVar207 = vsubps_avx(auVar126,auVar93);
            fVar200 = auVar93._0_4_;
            fVar221 = auVar93._4_4_;
            fVar224 = auVar93._8_4_;
            fVar226 = auVar93._12_4_;
            fVar229 = auVar207._0_4_;
            fVar242 = auVar207._4_4_;
            fVar243 = auVar207._8_4_;
            fVar244 = auVar207._12_4_;
            auVar157._0_4_ = auVar283._0_4_ * fVar200 + fVar229 * auVar332._0_4_;
            auVar157._4_4_ = auVar283._4_4_ * fVar221 + fVar242 * auVar332._4_4_;
            auVar157._8_4_ = auVar283._0_4_ * fVar224 + fVar243 * auVar332._0_4_;
            auVar157._12_4_ = auVar283._4_4_ * fVar226 + fVar244 * auVar332._4_4_;
            auVar209._0_4_ = auVar297._0_4_ * fVar200 + auVar344._0_4_ * fVar229;
            auVar209._4_4_ = auVar297._4_4_ * fVar221 + auVar344._4_4_ * fVar242;
            auVar209._8_4_ = auVar297._0_4_ * fVar224 + auVar344._0_4_ * fVar243;
            auVar209._12_4_ = auVar297._4_4_ * fVar226 + auVar344._4_4_ * fVar244;
            auVar234._0_4_ = auVar315._0_4_ * fVar200 + auVar360._0_4_ * fVar229;
            auVar234._4_4_ = auVar315._4_4_ * fVar221 + auVar360._4_4_ * fVar242;
            auVar234._8_4_ = auVar315._0_4_ * fVar224 + auVar360._0_4_ * fVar243;
            auVar234._12_4_ = auVar315._4_4_ * fVar226 + auVar360._4_4_ * fVar244;
            auVar90._0_4_ = auVar88._0_4_ * fVar200 + auVar268._0_4_ * fVar229;
            auVar90._4_4_ = auVar88._4_4_ * fVar221 + auVar268._4_4_ * fVar242;
            auVar90._8_4_ = auVar88._0_4_ * fVar224 + auVar268._0_4_ * fVar243;
            auVar90._12_4_ = auVar88._4_4_ * fVar226 + auVar268._4_4_ * fVar244;
            auVar144._16_16_ = auVar157;
            auVar144._0_16_ = auVar157;
            auVar174._16_16_ = auVar209;
            auVar174._0_16_ = auVar209;
            auVar220._16_16_ = auVar234;
            auVar220._0_16_ = auVar234;
            auVar105 = ZEXT2032(CONCAT416(fVar193,ZEXT416((uint)fVar197)));
            auVar105 = vshufps_avx(auVar105,auVar105,0);
            auVar18 = vsubps_avx(auVar174,auVar144);
            fVar200 = auVar105._0_4_;
            fVar221 = auVar105._4_4_;
            fVar224 = auVar105._8_4_;
            fVar226 = auVar105._12_4_;
            fVar229 = auVar105._16_4_;
            fVar242 = auVar105._20_4_;
            fVar243 = auVar105._24_4_;
            auVar145._0_4_ = auVar157._0_4_ + auVar18._0_4_ * fVar200;
            auVar145._4_4_ = auVar157._4_4_ + auVar18._4_4_ * fVar221;
            auVar145._8_4_ = auVar157._8_4_ + auVar18._8_4_ * fVar224;
            auVar145._12_4_ = auVar157._12_4_ + auVar18._12_4_ * fVar226;
            auVar145._16_4_ = auVar157._0_4_ + auVar18._16_4_ * fVar229;
            auVar145._20_4_ = auVar157._4_4_ + auVar18._20_4_ * fVar242;
            auVar145._24_4_ = auVar157._8_4_ + auVar18._24_4_ * fVar243;
            auVar145._28_4_ = auVar157._12_4_ + auVar18._28_4_;
            auVar105 = vsubps_avx(auVar220,auVar174);
            auVar175._0_4_ = auVar209._0_4_ + auVar105._0_4_ * fVar200;
            auVar175._4_4_ = auVar209._4_4_ + auVar105._4_4_ * fVar221;
            auVar175._8_4_ = auVar209._8_4_ + auVar105._8_4_ * fVar224;
            auVar175._12_4_ = auVar209._12_4_ + auVar105._12_4_ * fVar226;
            auVar175._16_4_ = auVar209._0_4_ + auVar105._16_4_ * fVar229;
            auVar175._20_4_ = auVar209._4_4_ + auVar105._20_4_ * fVar242;
            auVar175._24_4_ = auVar209._8_4_ + auVar105._24_4_ * fVar243;
            auVar175._28_4_ = auVar209._12_4_ + auVar105._28_4_;
            auVar93 = vsubps_avx(auVar90,auVar234);
            auVar109._0_4_ = auVar234._0_4_ + auVar93._0_4_ * fVar200;
            auVar109._4_4_ = auVar234._4_4_ + auVar93._4_4_ * fVar221;
            auVar109._8_4_ = auVar234._8_4_ + auVar93._8_4_ * fVar224;
            auVar109._12_4_ = auVar234._12_4_ + auVar93._12_4_ * fVar226;
            auVar109._16_4_ = auVar234._0_4_ + auVar93._0_4_ * fVar229;
            auVar109._20_4_ = auVar234._4_4_ + auVar93._4_4_ * fVar242;
            auVar109._24_4_ = auVar234._8_4_ + auVar93._8_4_ * fVar243;
            auVar109._28_4_ = auVar234._12_4_ + auVar93._12_4_;
            auVar105 = vsubps_avx(auVar175,auVar145);
            auVar146._0_4_ = auVar145._0_4_ + fVar200 * auVar105._0_4_;
            auVar146._4_4_ = auVar145._4_4_ + fVar221 * auVar105._4_4_;
            auVar146._8_4_ = auVar145._8_4_ + fVar224 * auVar105._8_4_;
            auVar146._12_4_ = auVar145._12_4_ + fVar226 * auVar105._12_4_;
            auVar146._16_4_ = auVar145._16_4_ + fVar229 * auVar105._16_4_;
            auVar146._20_4_ = auVar145._20_4_ + fVar242 * auVar105._20_4_;
            auVar146._24_4_ = auVar145._24_4_ + fVar243 * auVar105._24_4_;
            auVar146._28_4_ = auVar145._28_4_ + auVar105._28_4_;
            auVar105 = vsubps_avx(auVar109,auVar175);
            auVar110._0_4_ = auVar175._0_4_ + fVar200 * auVar105._0_4_;
            auVar110._4_4_ = auVar175._4_4_ + fVar221 * auVar105._4_4_;
            auVar110._8_4_ = auVar175._8_4_ + fVar224 * auVar105._8_4_;
            auVar110._12_4_ = auVar175._12_4_ + fVar226 * auVar105._12_4_;
            auVar110._16_4_ = auVar175._16_4_ + fVar229 * auVar105._16_4_;
            auVar110._20_4_ = auVar175._20_4_ + fVar242 * auVar105._20_4_;
            auVar110._24_4_ = auVar175._24_4_ + fVar243 * auVar105._24_4_;
            auVar110._28_4_ = auVar175._28_4_ + auVar105._28_4_;
            auVar105 = vsubps_avx(auVar110,auVar146);
            auVar254._0_4_ = auVar146._0_4_ + fVar200 * auVar105._0_4_;
            auVar254._4_4_ = auVar146._4_4_ + fVar221 * auVar105._4_4_;
            auVar254._8_4_ = auVar146._8_4_ + fVar224 * auVar105._8_4_;
            auVar254._12_4_ = auVar146._12_4_ + fVar226 * auVar105._12_4_;
            auVar259._16_4_ = auVar146._16_4_ + fVar229 * auVar105._16_4_;
            auVar259._0_16_ = auVar254;
            auVar259._20_4_ = auVar146._20_4_ + fVar242 * auVar105._20_4_;
            auVar259._24_4_ = auVar146._24_4_ + fVar243 * auVar105._24_4_;
            auVar259._28_4_ = auVar146._28_4_ + auVar175._28_4_;
            auVar260 = auVar259._16_16_;
            auVar128 = vshufps_avx(ZEXT416((uint)(fVar195 * 0.33333334)),
                                   ZEXT416((uint)(fVar195 * 0.33333334)),0);
            auVar210._0_4_ = auVar254._0_4_ + auVar128._0_4_ * auVar105._0_4_ * 3.0;
            auVar210._4_4_ = auVar254._4_4_ + auVar128._4_4_ * auVar105._4_4_ * 3.0;
            auVar210._8_4_ = auVar254._8_4_ + auVar128._8_4_ * auVar105._8_4_ * 3.0;
            auVar210._12_4_ = auVar254._12_4_ + auVar128._12_4_ * auVar105._12_4_ * 3.0;
            auVar173 = vshufpd_avx(auVar254,auVar254,3);
            auVar140 = vshufpd_avx(auVar260,auVar260,3);
            auVar93 = vsubps_avx(auVar173,auVar254);
            auVar207 = vsubps_avx(auVar140,auVar260);
            auVar91._0_4_ = auVar93._0_4_ + auVar207._0_4_;
            auVar91._4_4_ = auVar93._4_4_ + auVar207._4_4_;
            auVar91._8_4_ = auVar93._8_4_ + auVar207._8_4_;
            auVar91._12_4_ = auVar93._12_4_ + auVar207._12_4_;
            auVar93 = vmovshdup_avx(auVar254);
            auVar207 = vmovshdup_avx(auVar210);
            auVar159 = vshufps_avx(auVar91,auVar91,0);
            auVar129 = vshufps_avx(auVar91,auVar91,0x55);
            fVar200 = auVar129._0_4_;
            fVar221 = auVar129._4_4_;
            fVar224 = auVar129._8_4_;
            fVar226 = auVar129._12_4_;
            fVar229 = auVar159._0_4_;
            fVar242 = auVar159._4_4_;
            fVar243 = auVar159._8_4_;
            fVar244 = auVar159._12_4_;
            auVar92._0_4_ = fVar229 * auVar254._0_4_ + auVar93._0_4_ * fVar200;
            auVar92._4_4_ = fVar242 * auVar254._4_4_ + auVar93._4_4_ * fVar221;
            auVar92._8_4_ = fVar243 * auVar254._8_4_ + auVar93._8_4_ * fVar224;
            auVar92._12_4_ = fVar244 * auVar254._12_4_ + auVar93._12_4_ * fVar226;
            auVar322._0_4_ = fVar229 * auVar210._0_4_ + auVar207._0_4_ * fVar200;
            auVar322._4_4_ = fVar242 * auVar210._4_4_ + auVar207._4_4_ * fVar221;
            auVar322._8_4_ = fVar243 * auVar210._8_4_ + auVar207._8_4_ * fVar224;
            auVar322._12_4_ = fVar244 * auVar210._12_4_ + auVar207._12_4_ * fVar226;
            auVar207 = vshufps_avx(auVar92,auVar92,0xe8);
            auVar159 = vshufps_avx(auVar322,auVar322,0xe8);
            auVar93 = vcmpps_avx(auVar207,auVar159,1);
            uVar63 = vextractps_avx(auVar93,0);
            auVar129 = auVar322;
            if ((uVar63 & 1) == 0) {
              auVar129 = auVar92;
            }
            auVar127._0_4_ = auVar128._0_4_ * auVar105._16_4_ * 3.0;
            auVar127._4_4_ = auVar128._4_4_ * auVar105._20_4_ * 3.0;
            auVar127._8_4_ = auVar128._8_4_ * auVar105._24_4_ * 3.0;
            auVar127._12_4_ = auVar128._12_4_ * 0.0;
            auVar118 = vsubps_avx(auVar260,auVar127);
            auVar128 = vmovshdup_avx(auVar118);
            auVar260 = vmovshdup_avx(auVar260);
            fVar227 = auVar118._0_4_;
            fVar115 = auVar118._4_4_;
            auVar235._0_4_ = fVar227 * fVar229 + auVar128._0_4_ * fVar200;
            auVar235._4_4_ = fVar115 * fVar242 + auVar128._4_4_ * fVar221;
            auVar235._8_4_ = auVar118._8_4_ * fVar243 + auVar128._8_4_ * fVar224;
            auVar235._12_4_ = auVar118._12_4_ * fVar244 + auVar128._12_4_ * fVar226;
            auVar361._0_4_ = fVar229 * auVar259._16_4_ + auVar260._0_4_ * fVar200;
            auVar361._4_4_ = fVar242 * auVar259._20_4_ + auVar260._4_4_ * fVar221;
            auVar361._8_4_ = fVar243 * auVar259._24_4_ + auVar260._8_4_ * fVar224;
            auVar361._12_4_ = fVar244 * auVar259._28_4_ + auVar260._12_4_ * fVar226;
            auVar260 = vshufps_avx(auVar235,auVar235,0xe8);
            auVar15 = vshufps_avx(auVar361,auVar361,0xe8);
            auVar128 = vcmpps_avx(auVar260,auVar15,1);
            uVar63 = vextractps_avx(auVar128,0);
            auVar119 = auVar361;
            if ((uVar63 & 1) == 0) {
              auVar119 = auVar235;
            }
            auVar129 = vmaxss_avx(auVar119,auVar129);
            auVar207 = vminps_avx(auVar207,auVar159);
            auVar159 = vminps_avx(auVar260,auVar15);
            auVar159 = vminps_avx(auVar207,auVar159);
            auVar93 = vshufps_avx(auVar93,auVar93,0x55);
            auVar93 = vblendps_avx(auVar93,auVar128,2);
            auVar128 = vpslld_avx(auVar93,0x1f);
            auVar93 = vshufpd_avx(auVar322,auVar322,1);
            auVar93 = vinsertps_avx(auVar93,auVar361,0x9c);
            auVar207 = vshufpd_avx(auVar92,auVar92,1);
            auVar207 = vinsertps_avx(auVar207,auVar235,0x9c);
            auVar93 = vblendvps_avx(auVar207,auVar93,auVar128);
            auVar207 = vmovshdup_avx(auVar93);
            auVar93 = vmaxss_avx(auVar207,auVar93);
            fVar224 = auVar159._0_4_;
            auVar207 = vmovshdup_avx(auVar159);
            fVar221 = auVar93._0_4_;
            fVar226 = auVar207._0_4_;
            fVar200 = auVar129._0_4_;
            if ((fVar224 < 0.0001) && (-0.0001 < fVar221)) break;
            if ((fVar226 < 0.0001 && -0.0001 < fVar200) || (fVar224 < 0.0001 && -0.0001 < fVar200))
            break;
            auVar128 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar93,1);
            auVar207 = vcmpps_avx(auVar207,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar207 = vandps_avx(auVar207,auVar128);
          } while ((auVar207 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar128 = vcmpps_avx(auVar159,_DAT_01f45a50,1);
          auVar207 = vcmpss_avx(auVar129,ZEXT416(0) << 0x20,1);
          auVar158._8_4_ = 0x3f800000;
          auVar158._0_8_ = 0x3f8000003f800000;
          auVar158._12_4_ = 0x3f800000;
          auVar211._8_4_ = 0xbf800000;
          auVar211._0_8_ = 0xbf800000bf800000;
          auVar211._12_4_ = 0xbf800000;
          auVar207 = vblendvps_avx(auVar158,auVar211,auVar207);
          auVar128 = vblendvps_avx(auVar158,auVar211,auVar128);
          auVar159 = vcmpss_avx(auVar128,auVar207,4);
          auVar159 = vpshufd_avx(ZEXT416(auVar159._0_4_ & 1),0x50);
          auVar159 = vpslld_avx(auVar159,0x1f);
          auVar159 = vpsrad_avx(auVar159,0x1f);
          auVar159 = vpandn_avx(auVar159,_DAT_01f7afb0);
          auVar129 = vmovshdup_avx(auVar128);
          fVar229 = auVar129._0_4_;
          if ((auVar128._0_4_ != fVar229) || (NAN(auVar128._0_4_) || NAN(fVar229))) {
            if ((fVar226 != fVar224) || (NAN(fVar226) || NAN(fVar224))) {
              fVar224 = -fVar224 / (fVar226 - fVar224);
              auVar128 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar224) * 0.0 + fVar224)));
            }
            else {
              auVar128 = ZEXT816(0x3f80000000000000);
              if ((fVar224 != 0.0) || (NAN(fVar224))) {
                auVar128 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar260 = vcmpps_avx(auVar159,auVar128,1);
            auVar129 = vblendps_avx(auVar159,auVar128,2);
            auVar128 = vblendps_avx(auVar128,auVar159,2);
            auVar159 = vblendvps_avx(auVar128,auVar129,auVar260);
          }
          auVar93 = vcmpss_avx(auVar93,ZEXT416(0) << 0x20,1);
          auVar160._8_4_ = 0x3f800000;
          auVar160._0_8_ = 0x3f8000003f800000;
          auVar160._12_4_ = 0x3f800000;
          auVar212._8_4_ = 0xbf800000;
          auVar212._0_8_ = 0xbf800000bf800000;
          auVar212._12_4_ = 0xbf800000;
          auVar93 = vblendvps_avx(auVar160,auVar212,auVar93);
          fVar224 = auVar93._0_4_;
          if ((auVar207._0_4_ != fVar224) || (NAN(auVar207._0_4_) || NAN(fVar224))) {
            if ((fVar221 != fVar200) || (NAN(fVar221) || NAN(fVar200))) {
              fVar200 = -fVar200 / (fVar221 - fVar200);
              auVar93 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar200) * 0.0 + fVar200)));
            }
            else {
              auVar93 = ZEXT816(0x3f80000000000000);
              if ((fVar200 != 0.0) || (NAN(fVar200))) {
                auVar93 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar128 = vcmpps_avx(auVar159,auVar93,1);
            auVar207 = vblendps_avx(auVar159,auVar93,2);
            auVar93 = vblendps_avx(auVar93,auVar159,2);
            auVar159 = vblendvps_avx(auVar93,auVar207,auVar128);
          }
          if ((fVar229 != fVar224) || (NAN(fVar229) || NAN(fVar224))) {
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = 0x3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar93 = vcmpps_avx(auVar159,auVar94,1);
            auVar207 = vinsertps_avx(auVar159,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar161._4_12_ = auVar159._4_12_;
            auVar161._0_4_ = 0x3f800000;
            auVar159 = vblendvps_avx(auVar161,auVar207,auVar93);
          }
          auVar93 = vcmpps_avx(auVar159,_DAT_01f46740,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar159._4_12_;
          auVar207 = vinsertps_avx(auVar159,ZEXT416(0x3f800000),0x10);
          auVar93 = vblendvps_avx(auVar207,auVar54 << 0x20,auVar93);
          auVar207 = vmovshdup_avx(auVar93);
        } while (auVar207._0_4_ < auVar93._0_4_);
        auVar95._0_4_ = auVar93._0_4_ + -0.1;
        auVar95._4_4_ = auVar93._4_4_ + 0.1;
        auVar95._8_4_ = auVar93._8_4_ + 0.0;
        auVar95._12_4_ = auVar93._12_4_ + 0.0;
        auVar128 = vshufpd_avx(auVar210,auVar210,3);
        auVar255._8_8_ = 0x3f80000000000000;
        auVar255._0_8_ = 0x3f80000000000000;
        auVar93 = vcmpps_avx(auVar95,auVar255,1);
        auVar52._12_4_ = 0;
        auVar52._0_12_ = auVar95._4_12_;
        auVar207 = vinsertps_avx(auVar95,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar93 = vblendvps_avx(auVar207,auVar52 << 0x20,auVar93);
        auVar207 = vshufpd_avx(auVar118,auVar118,3);
        auVar159 = vshufps_avx(auVar93,auVar93,0x50);
        auVar256._8_4_ = 0x3f800000;
        auVar256._0_8_ = 0x3f8000003f800000;
        auVar256._12_4_ = 0x3f800000;
        auVar129 = vsubps_avx(auVar256,auVar159);
        local_600 = auVar173._0_4_;
        fStack_5fc = auVar173._4_4_;
        fStack_5f8 = auVar173._8_4_;
        fStack_5f4 = auVar173._12_4_;
        fVar200 = auVar159._0_4_;
        fVar221 = auVar159._4_4_;
        fVar224 = auVar159._8_4_;
        fVar226 = auVar159._12_4_;
        local_680 = auVar140._0_4_;
        fStack_67c = auVar140._4_4_;
        fStack_678 = auVar140._8_4_;
        fStack_674 = auVar140._12_4_;
        fVar229 = auVar129._0_4_;
        fVar242 = auVar129._4_4_;
        fVar243 = auVar129._8_4_;
        fVar244 = auVar129._12_4_;
        auVar96._0_4_ = fVar200 * local_600 + fVar229 * auVar254._0_4_;
        auVar96._4_4_ = fVar221 * fStack_5fc + fVar242 * auVar254._4_4_;
        auVar96._8_4_ = fVar224 * fStack_5f8 + fVar243 * auVar254._0_4_;
        auVar96._12_4_ = fVar226 * fStack_5f4 + fVar244 * auVar254._4_4_;
        auVar236._0_4_ = auVar128._0_4_ * fVar200 + fVar229 * auVar210._0_4_;
        auVar236._4_4_ = auVar128._4_4_ * fVar221 + fVar242 * auVar210._4_4_;
        auVar236._8_4_ = auVar128._8_4_ * fVar224 + fVar243 * auVar210._0_4_;
        auVar236._12_4_ = auVar128._12_4_ * fVar226 + fVar244 * auVar210._4_4_;
        auVar270._0_4_ = auVar207._0_4_ * fVar200 + fVar229 * fVar227;
        auVar270._4_4_ = auVar207._4_4_ * fVar221 + fVar242 * fVar115;
        auVar270._8_4_ = auVar207._8_4_ * fVar224 + fVar243 * fVar227;
        auVar270._12_4_ = auVar207._12_4_ * fVar226 + fVar244 * fVar115;
        auVar316._0_4_ = fVar200 * local_680 + fVar229 * auVar259._16_4_;
        auVar316._4_4_ = fVar221 * fStack_67c + fVar242 * auVar259._20_4_;
        auVar316._8_4_ = fVar224 * fStack_678 + fVar243 * auVar259._16_4_;
        auVar316._12_4_ = fVar226 * fStack_674 + fVar244 * auVar259._20_4_;
        auVar140 = vsubps_avx(auVar256,auVar93);
        auVar207 = vmovshdup_avx(auVar352);
        auVar173 = vmovsldup_avx(auVar352);
        auVar257._0_4_ = auVar140._0_4_ * auVar173._0_4_ + auVar93._0_4_ * auVar207._0_4_;
        auVar257._4_4_ = auVar140._4_4_ * auVar173._4_4_ + auVar93._4_4_ * auVar207._4_4_;
        auVar257._8_4_ = auVar140._8_4_ * auVar173._8_4_ + auVar93._8_4_ * auVar207._8_4_;
        auVar257._12_4_ = auVar140._12_4_ * auVar173._12_4_ + auVar93._12_4_ * auVar207._12_4_;
        auVar118 = vmovshdup_avx(auVar257);
        auVar93 = vsubps_avx(auVar236,auVar96);
        auVar162._0_4_ = auVar93._0_4_ * 3.0;
        auVar162._4_4_ = auVar93._4_4_ * 3.0;
        auVar162._8_4_ = auVar93._8_4_ * 3.0;
        auVar162._12_4_ = auVar93._12_4_ * 3.0;
        auVar93 = vsubps_avx(auVar270,auVar236);
        auVar189._0_4_ = auVar93._0_4_ * 3.0;
        auVar189._4_4_ = auVar93._4_4_ * 3.0;
        auVar189._8_4_ = auVar93._8_4_ * 3.0;
        auVar189._12_4_ = auVar93._12_4_ * 3.0;
        auVar93 = vsubps_avx(auVar316,auVar270);
        auVar284._0_4_ = auVar93._0_4_ * 3.0;
        auVar284._4_4_ = auVar93._4_4_ * 3.0;
        auVar284._8_4_ = auVar93._8_4_ * 3.0;
        auVar284._12_4_ = auVar93._12_4_ * 3.0;
        auVar207 = vminps_avx(auVar189,auVar284);
        auVar93 = vmaxps_avx(auVar189,auVar284);
        auVar207 = vminps_avx(auVar162,auVar207);
        auVar93 = vmaxps_avx(auVar162,auVar93);
        auVar173 = vshufpd_avx(auVar207,auVar207,3);
        auVar140 = vshufpd_avx(auVar93,auVar93,3);
        auVar207 = vminps_avx(auVar207,auVar173);
        auVar93 = vmaxps_avx(auVar93,auVar140);
        auVar173 = vshufps_avx(ZEXT416((uint)(1.0 / fVar195)),ZEXT416((uint)(1.0 / fVar195)),0);
        auVar285._0_4_ = auVar173._0_4_ * auVar207._0_4_;
        auVar285._4_4_ = auVar173._4_4_ * auVar207._4_4_;
        auVar285._8_4_ = auVar173._8_4_ * auVar207._8_4_;
        auVar285._12_4_ = auVar173._12_4_ * auVar207._12_4_;
        auVar298._0_4_ = auVar173._0_4_ * auVar93._0_4_;
        auVar298._4_4_ = auVar173._4_4_ * auVar93._4_4_;
        auVar298._8_4_ = auVar173._8_4_ * auVar93._8_4_;
        auVar298._12_4_ = auVar173._12_4_ * auVar93._12_4_;
        auVar129 = ZEXT416((uint)(1.0 / (auVar118._0_4_ - auVar257._0_4_)));
        auVar93 = vshufpd_avx(auVar96,auVar96,3);
        auVar207 = vshufpd_avx(auVar236,auVar236,3);
        auVar173 = vshufpd_avx(auVar270,auVar270,3);
        auVar140 = vshufpd_avx(auVar316,auVar316,3);
        auVar93 = vsubps_avx(auVar93,auVar96);
        auVar128 = vsubps_avx(auVar207,auVar236);
        auVar159 = vsubps_avx(auVar173,auVar270);
        auVar140 = vsubps_avx(auVar140,auVar316);
        auVar207 = vminps_avx(auVar93,auVar128);
        auVar93 = vmaxps_avx(auVar93,auVar128);
        auVar173 = vminps_avx(auVar159,auVar140);
        auVar173 = vminps_avx(auVar207,auVar173);
        auVar207 = vmaxps_avx(auVar159,auVar140);
        auVar93 = vmaxps_avx(auVar93,auVar207);
        auVar207 = vshufps_avx(auVar129,auVar129,0);
        auVar345._0_4_ = auVar207._0_4_ * auVar173._0_4_;
        auVar345._4_4_ = auVar207._4_4_ * auVar173._4_4_;
        auVar345._8_4_ = auVar207._8_4_ * auVar173._8_4_;
        auVar345._12_4_ = auVar207._12_4_ * auVar173._12_4_;
        auVar353._0_4_ = auVar207._0_4_ * auVar93._0_4_;
        auVar353._4_4_ = auVar207._4_4_ * auVar93._4_4_;
        auVar353._8_4_ = auVar207._8_4_ * auVar93._8_4_;
        auVar353._12_4_ = auVar207._12_4_ * auVar93._12_4_;
        auVar93 = vmovsldup_avx(auVar257);
        auVar317._4_12_ = auVar93._4_12_;
        auVar317._0_4_ = fVar197;
        auVar323._4_12_ = auVar257._4_12_;
        auVar323._0_4_ = fVar193;
        auVar190._0_4_ = (fVar197 + fVar193) * 0.5;
        auVar190._4_4_ = (auVar93._4_4_ + auVar257._4_4_) * 0.5;
        auVar190._8_4_ = (auVar93._8_4_ + auVar257._8_4_) * 0.5;
        auVar190._12_4_ = (auVar93._12_4_ + auVar257._12_4_) * 0.5;
        auVar93 = vshufps_avx(auVar190,auVar190,0);
        fVar200 = auVar93._0_4_;
        fVar221 = auVar93._4_4_;
        fVar224 = auVar93._8_4_;
        fVar226 = auVar93._12_4_;
        local_6d0._0_4_ = auVar280._0_4_;
        local_6d0._4_4_ = auVar280._4_4_;
        fStack_6c8 = auVar280._8_4_;
        fStack_6c4 = auVar280._12_4_;
        auVar130._0_4_ = fVar200 * (float)local_350._0_4_ + (float)local_6d0._0_4_;
        auVar130._4_4_ = fVar221 * (float)local_350._4_4_ + (float)local_6d0._4_4_;
        auVar130._8_4_ = fVar224 * fStack_348 + fStack_6c8;
        auVar130._12_4_ = fVar226 * fStack_344 + fStack_6c4;
        local_630 = auVar251._0_4_;
        fStack_62c = auVar251._4_4_;
        fStack_628 = auVar251._8_4_;
        fStack_624 = auVar251._12_4_;
        auVar163._0_4_ = fVar200 * (float)local_360._0_4_ + local_630;
        auVar163._4_4_ = fVar221 * (float)local_360._4_4_ + fStack_62c;
        auVar163._8_4_ = fVar224 * fStack_358 + fStack_628;
        auVar163._12_4_ = fVar226 * fStack_354 + fStack_624;
        local_640 = auVar14._0_4_;
        fStack_63c = auVar14._4_4_;
        fStack_638 = auVar14._8_4_;
        fStack_634 = auVar14._12_4_;
        auVar237._0_4_ = fVar200 * (float)local_370._0_4_ + local_640;
        auVar237._4_4_ = fVar221 * (float)local_370._4_4_ + fStack_63c;
        auVar237._8_4_ = fVar224 * fStack_368 + fStack_638;
        auVar237._12_4_ = fVar226 * fStack_364 + fStack_634;
        auVar93 = vsubps_avx(auVar163,auVar130);
        auVar131._0_4_ = auVar130._0_4_ + fVar200 * auVar93._0_4_;
        auVar131._4_4_ = auVar130._4_4_ + fVar221 * auVar93._4_4_;
        auVar131._8_4_ = auVar130._8_4_ + fVar224 * auVar93._8_4_;
        auVar131._12_4_ = auVar130._12_4_ + fVar226 * auVar93._12_4_;
        auVar93 = vsubps_avx(auVar237,auVar163);
        auVar164._0_4_ = auVar163._0_4_ + fVar200 * auVar93._0_4_;
        auVar164._4_4_ = auVar163._4_4_ + fVar221 * auVar93._4_4_;
        auVar164._8_4_ = auVar163._8_4_ + fVar224 * auVar93._8_4_;
        auVar164._12_4_ = auVar163._12_4_ + fVar226 * auVar93._12_4_;
        auVar93 = vsubps_avx(auVar164,auVar131);
        fVar200 = auVar131._0_4_ + fVar200 * auVar93._0_4_;
        fVar221 = auVar131._4_4_ + fVar221 * auVar93._4_4_;
        auVar97._0_8_ = CONCAT44(fVar221,fVar200);
        auVar97._8_4_ = auVar131._8_4_ + fVar224 * auVar93._8_4_;
        auVar97._12_4_ = auVar131._12_4_ + fVar226 * auVar93._12_4_;
        fVar224 = auVar93._0_4_ * 3.0;
        fVar226 = auVar93._4_4_ * 3.0;
        auVar132._0_8_ = CONCAT44(fVar226,fVar224);
        auVar132._8_4_ = auVar93._8_4_ * 3.0;
        auVar132._12_4_ = auVar93._12_4_ * 3.0;
        auVar165._8_8_ = auVar97._0_8_;
        auVar165._0_8_ = auVar97._0_8_;
        auVar93 = vshufpd_avx(auVar97,auVar97,3);
        auVar207 = vshufps_avx(auVar190,auVar190,0x55);
        auVar159 = vsubps_avx(auVar93,auVar165);
        auVar333._0_4_ = auVar159._0_4_ * auVar207._0_4_ + fVar200;
        auVar333._4_4_ = auVar159._4_4_ * auVar207._4_4_ + fVar221;
        auVar333._8_4_ = auVar159._8_4_ * auVar207._8_4_ + fVar200;
        auVar333._12_4_ = auVar159._12_4_ * auVar207._12_4_ + fVar221;
        auVar166._8_8_ = auVar132._0_8_;
        auVar166._0_8_ = auVar132._0_8_;
        auVar93 = vshufpd_avx(auVar132,auVar132,1);
        auVar93 = vsubps_avx(auVar93,auVar166);
        auVar133._0_4_ = auVar93._0_4_ * auVar207._0_4_ + fVar224;
        auVar133._4_4_ = auVar93._4_4_ * auVar207._4_4_ + fVar226;
        auVar133._8_4_ = auVar93._8_4_ * auVar207._8_4_ + fVar224;
        auVar133._12_4_ = auVar93._12_4_ * auVar207._12_4_ + fVar226;
        auVar207 = vmovshdup_avx(auVar133);
        auVar238._0_8_ = auVar207._0_8_ ^ 0x8000000080000000;
        auVar238._8_4_ = auVar207._8_4_ ^ 0x80000000;
        auVar238._12_4_ = auVar207._12_4_ ^ 0x80000000;
        auVar173 = vmovshdup_avx(auVar159);
        auVar93 = vunpcklps_avx(auVar173,auVar238);
        auVar140 = vshufps_avx(auVar93,auVar238,4);
        auVar98._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
        auVar98._8_4_ = -auVar159._8_4_;
        auVar98._12_4_ = -auVar159._12_4_;
        auVar93 = vmovlhps_avx(auVar98,auVar133);
        auVar128 = vshufps_avx(auVar93,auVar133,8);
        auVar93 = ZEXT416((uint)(auVar133._0_4_ * auVar173._0_4_ - auVar159._0_4_ * auVar207._0_4_))
        ;
        auVar207 = vshufps_avx(auVar93,auVar93,0);
        auVar93 = vdivps_avx(auVar140,auVar207);
        auVar207 = vdivps_avx(auVar128,auVar207);
        auVar128 = vinsertps_avx(auVar285,auVar345,0x1c);
        auVar159 = vinsertps_avx(auVar298,auVar353,0x1c);
        auVar129 = vinsertps_avx(auVar345,auVar285,0x4c);
        auVar260 = vinsertps_avx(auVar353,auVar298,0x4c);
        auVar173 = vmovsldup_avx(auVar93);
        auVar167._0_4_ = auVar173._0_4_ * auVar128._0_4_;
        auVar167._4_4_ = auVar173._4_4_ * auVar128._4_4_;
        auVar167._8_4_ = auVar173._8_4_ * auVar128._8_4_;
        auVar167._12_4_ = auVar173._12_4_ * auVar128._12_4_;
        auVar134._0_4_ = auVar159._0_4_ * auVar173._0_4_;
        auVar134._4_4_ = auVar159._4_4_ * auVar173._4_4_;
        auVar134._8_4_ = auVar159._8_4_ * auVar173._8_4_;
        auVar134._12_4_ = auVar159._12_4_ * auVar173._12_4_;
        auVar140 = vminps_avx(auVar167,auVar134);
        auVar173 = vmaxps_avx(auVar134,auVar167);
        auVar15 = vmovsldup_avx(auVar207);
        auVar354._0_4_ = auVar129._0_4_ * auVar15._0_4_;
        auVar354._4_4_ = auVar129._4_4_ * auVar15._4_4_;
        auVar354._8_4_ = auVar129._8_4_ * auVar15._8_4_;
        auVar354._12_4_ = auVar129._12_4_ * auVar15._12_4_;
        auVar168._0_4_ = auVar260._0_4_ * auVar15._0_4_;
        auVar168._4_4_ = auVar260._4_4_ * auVar15._4_4_;
        auVar168._8_4_ = auVar260._8_4_ * auVar15._8_4_;
        auVar168._12_4_ = auVar260._12_4_ * auVar15._12_4_;
        auVar15 = vminps_avx(auVar354,auVar168);
        auVar213._0_4_ = auVar140._0_4_ + auVar15._0_4_;
        auVar213._4_4_ = auVar140._4_4_ + auVar15._4_4_;
        auVar213._8_4_ = auVar140._8_4_ + auVar15._8_4_;
        auVar213._12_4_ = auVar140._12_4_ + auVar15._12_4_;
        auVar140 = vmaxps_avx(auVar168,auVar354);
        auVar15 = vsubps_avx(auVar317,auVar190);
        auVar119 = vsubps_avx(auVar323,auVar190);
        auVar135._0_4_ = auVar173._0_4_ + auVar140._0_4_;
        auVar135._4_4_ = auVar173._4_4_ + auVar140._4_4_;
        auVar135._8_4_ = auVar173._8_4_ + auVar140._8_4_;
        auVar135._12_4_ = auVar173._12_4_ + auVar140._12_4_;
        auVar169._8_8_ = 0x3f800000;
        auVar169._0_8_ = 0x3f800000;
        auVar173 = vsubps_avx(auVar169,auVar135);
        auVar140 = vsubps_avx(auVar169,auVar213);
        fVar243 = auVar15._0_4_;
        auVar214._0_4_ = fVar243 * auVar173._0_4_;
        fVar244 = auVar15._4_4_;
        auVar214._4_4_ = fVar244 * auVar173._4_4_;
        fVar227 = auVar15._8_4_;
        auVar214._8_4_ = fVar227 * auVar173._8_4_;
        fVar115 = auVar15._12_4_;
        auVar214._12_4_ = fVar115 * auVar173._12_4_;
        fVar224 = auVar119._0_4_;
        auVar136._0_4_ = fVar224 * auVar173._0_4_;
        fVar226 = auVar119._4_4_;
        auVar136._4_4_ = fVar226 * auVar173._4_4_;
        fVar229 = auVar119._8_4_;
        auVar136._8_4_ = fVar229 * auVar173._8_4_;
        fVar242 = auVar119._12_4_;
        auVar136._12_4_ = fVar242 * auVar173._12_4_;
        auVar324._0_4_ = fVar243 * auVar140._0_4_;
        auVar324._4_4_ = fVar244 * auVar140._4_4_;
        auVar324._8_4_ = fVar227 * auVar140._8_4_;
        auVar324._12_4_ = fVar115 * auVar140._12_4_;
        auVar170._0_4_ = fVar224 * auVar140._0_4_;
        auVar170._4_4_ = fVar226 * auVar140._4_4_;
        auVar170._8_4_ = fVar229 * auVar140._8_4_;
        auVar170._12_4_ = fVar242 * auVar140._12_4_;
        auVar173 = vminps_avx(auVar214,auVar324);
        auVar140 = vminps_avx(auVar136,auVar170);
        auVar15 = vminps_avx(auVar173,auVar140);
        auVar173 = vmaxps_avx(auVar324,auVar214);
        auVar140 = vmaxps_avx(auVar170,auVar136);
        auVar119 = vshufps_avx(auVar190,auVar190,0x54);
        auVar140 = vmaxps_avx(auVar140,auVar173);
        auVar120 = vshufps_avx(auVar333,auVar333,0);
        auVar148 = vshufps_avx(auVar333,auVar333,0x55);
        auVar173 = vhaddps_avx(auVar15,auVar15);
        auVar140 = vhaddps_avx(auVar140,auVar140);
        auVar191._0_4_ = auVar120._0_4_ * auVar93._0_4_ + auVar148._0_4_ * auVar207._0_4_;
        auVar191._4_4_ = auVar120._4_4_ * auVar93._4_4_ + auVar148._4_4_ * auVar207._4_4_;
        auVar191._8_4_ = auVar120._8_4_ * auVar93._8_4_ + auVar148._8_4_ * auVar207._8_4_;
        auVar191._12_4_ = auVar120._12_4_ * auVar93._12_4_ + auVar148._12_4_ * auVar207._12_4_;
        auVar15 = vsubps_avx(auVar119,auVar191);
        fVar200 = auVar15._0_4_ + auVar173._0_4_;
        fVar221 = auVar15._0_4_ + auVar140._0_4_;
        auVar173 = vmaxss_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar200));
        auVar140 = vminss_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar193));
      } while (auVar140._0_4_ < auVar173._0_4_);
      auVar173 = vmovshdup_avx(auVar93);
      auVar99._0_4_ = auVar173._0_4_ * auVar128._0_4_;
      auVar99._4_4_ = auVar173._4_4_ * auVar128._4_4_;
      auVar99._8_4_ = auVar173._8_4_ * auVar128._8_4_;
      auVar99._12_4_ = auVar173._12_4_ * auVar128._12_4_;
      auVar137._0_4_ = auVar159._0_4_ * auVar173._0_4_;
      auVar137._4_4_ = auVar159._4_4_ * auVar173._4_4_;
      auVar137._8_4_ = auVar159._8_4_ * auVar173._8_4_;
      auVar137._12_4_ = auVar159._12_4_ * auVar173._12_4_;
      auVar140 = vminps_avx(auVar99,auVar137);
      auVar173 = vmaxps_avx(auVar137,auVar99);
      auVar128 = vmovshdup_avx(auVar207);
      auVar215._0_4_ = auVar129._0_4_ * auVar128._0_4_;
      auVar215._4_4_ = auVar129._4_4_ * auVar128._4_4_;
      auVar215._8_4_ = auVar129._8_4_ * auVar128._8_4_;
      auVar215._12_4_ = auVar129._12_4_ * auVar128._12_4_;
      auVar138._0_4_ = auVar260._0_4_ * auVar128._0_4_;
      auVar138._4_4_ = auVar260._4_4_ * auVar128._4_4_;
      auVar138._8_4_ = auVar260._8_4_ * auVar128._8_4_;
      auVar138._12_4_ = auVar260._12_4_ * auVar128._12_4_;
      auVar128 = vminps_avx(auVar215,auVar138);
      auVar171._0_4_ = auVar140._0_4_ + auVar128._0_4_;
      auVar171._4_4_ = auVar140._4_4_ + auVar128._4_4_;
      auVar171._8_4_ = auVar140._8_4_ + auVar128._8_4_;
      auVar171._12_4_ = auVar140._12_4_ + auVar128._12_4_;
      auVar140 = vmaxps_avx(auVar138,auVar215);
      auVar100._0_4_ = auVar173._0_4_ + auVar140._0_4_;
      auVar100._4_4_ = auVar173._4_4_ + auVar140._4_4_;
      auVar100._8_4_ = auVar173._8_4_ + auVar140._8_4_;
      auVar100._12_4_ = auVar173._12_4_ + auVar140._12_4_;
      auVar173 = vsubps_avx(auVar255,auVar100);
      auVar140 = vsubps_avx(auVar255,auVar171);
      auVar172._0_4_ = fVar243 * auVar173._0_4_;
      auVar172._4_4_ = fVar244 * auVar173._4_4_;
      auVar172._8_4_ = fVar227 * auVar173._8_4_;
      auVar172._12_4_ = fVar115 * auVar173._12_4_;
      auVar216._0_4_ = fVar243 * auVar140._0_4_;
      auVar216._4_4_ = fVar244 * auVar140._4_4_;
      auVar216._8_4_ = fVar227 * auVar140._8_4_;
      auVar216._12_4_ = fVar115 * auVar140._12_4_;
      auVar101._0_4_ = fVar224 * auVar173._0_4_;
      auVar101._4_4_ = fVar226 * auVar173._4_4_;
      auVar101._8_4_ = fVar229 * auVar173._8_4_;
      auVar101._12_4_ = fVar242 * auVar173._12_4_;
      auVar139._0_4_ = fVar224 * auVar140._0_4_;
      auVar139._4_4_ = fVar226 * auVar140._4_4_;
      auVar139._8_4_ = fVar229 * auVar140._8_4_;
      auVar139._12_4_ = fVar242 * auVar140._12_4_;
      auVar173 = vminps_avx(auVar172,auVar216);
      auVar140 = vminps_avx(auVar101,auVar139);
      auVar173 = vminps_avx(auVar173,auVar140);
      auVar140 = vmaxps_avx(auVar216,auVar172);
      auVar128 = vmaxps_avx(auVar139,auVar101);
      auVar173 = vhaddps_avx(auVar173,auVar173);
      auVar140 = vmaxps_avx(auVar128,auVar140);
      auVar140 = vhaddps_avx(auVar140,auVar140);
      auVar128 = vmovshdup_avx(auVar15);
      auVar159 = ZEXT416((uint)(auVar128._0_4_ + auVar173._0_4_));
      auVar173 = vmaxss_avx(auVar257,auVar159);
      auVar128 = ZEXT416((uint)(auVar128._0_4_ + auVar140._0_4_));
      auVar140 = vminss_avx(auVar128,auVar118);
    } while (auVar140._0_4_ < auVar173._0_4_);
    bVar70 = 0;
    if ((fVar197 < fVar200) && (fVar221 < fVar193)) {
      auVar173 = vcmpps_avx(auVar128,auVar118,1);
      auVar140 = vcmpps_avx(auVar257,auVar159,1);
      auVar173 = vandps_avx(auVar140,auVar173);
      bVar70 = auVar173[0];
    }
    auVar286._8_4_ = 0x7fffffff;
    auVar286._0_8_ = 0x7fffffff7fffffff;
    auVar286._12_4_ = 0x7fffffff;
    if ((3 < (uint)uVar66 || fVar195 < 0.001) || (bVar70 & 1) != 0) {
      lVar68 = 0xc9;
      do {
        lVar68 = lVar68 + -1;
        if (lVar68 == 0) goto LAB_0094e41e;
        fVar195 = auVar15._0_4_;
        fVar193 = 1.0 - fVar195;
        auVar173 = ZEXT416((uint)(fVar193 * fVar193 * fVar193));
        auVar173 = vshufps_avx(auVar173,auVar173,0);
        auVar140 = ZEXT416((uint)(fVar195 * 3.0 * fVar193 * fVar193));
        auVar140 = vshufps_avx(auVar140,auVar140,0);
        auVar128 = ZEXT416((uint)(fVar193 * fVar195 * fVar195 * 3.0));
        auVar128 = vshufps_avx(auVar128,auVar128,0);
        auVar159 = ZEXT416((uint)(fVar195 * fVar195 * fVar195));
        auVar159 = vshufps_avx(auVar159,auVar159,0);
        fVar193 = (float)local_6d0._0_4_ * auVar173._0_4_ +
                  local_630 * auVar140._0_4_ +
                  (float)local_380._0_4_ * auVar159._0_4_ + local_640 * auVar128._0_4_;
        fVar195 = (float)local_6d0._4_4_ * auVar173._4_4_ +
                  fStack_62c * auVar140._4_4_ +
                  (float)local_380._4_4_ * auVar159._4_4_ + fStack_63c * auVar128._4_4_;
        auVar102._0_8_ = CONCAT44(fVar195,fVar193);
        auVar102._8_4_ =
             fStack_6c8 * auVar173._8_4_ +
             fStack_628 * auVar140._8_4_ + fStack_378 * auVar159._8_4_ + fStack_638 * auVar128._8_4_
        ;
        auVar102._12_4_ =
             fStack_6c4 * auVar173._12_4_ +
             fStack_624 * auVar140._12_4_ +
             fStack_374 * auVar159._12_4_ + fStack_634 * auVar128._12_4_;
        auVar141._8_8_ = auVar102._0_8_;
        auVar141._0_8_ = auVar102._0_8_;
        auVar140 = vshufpd_avx(auVar102,auVar102,1);
        auVar173 = vmovshdup_avx(auVar15);
        auVar140 = vsubps_avx(auVar140,auVar141);
        auVar103._0_4_ = auVar173._0_4_ * auVar140._0_4_ + fVar193;
        auVar103._4_4_ = auVar173._4_4_ * auVar140._4_4_ + fVar195;
        auVar103._8_4_ = auVar173._8_4_ * auVar140._8_4_ + fVar193;
        auVar103._12_4_ = auVar173._12_4_ * auVar140._12_4_ + fVar195;
        auVar173 = vshufps_avx(auVar103,auVar103,0);
        auVar140 = vshufps_avx(auVar103,auVar103,0x55);
        auVar142._0_4_ = auVar93._0_4_ * auVar173._0_4_ + auVar207._0_4_ * auVar140._0_4_;
        auVar142._4_4_ = auVar93._4_4_ * auVar173._4_4_ + auVar207._4_4_ * auVar140._4_4_;
        auVar142._8_4_ = auVar93._8_4_ * auVar173._8_4_ + auVar207._8_4_ * auVar140._8_4_;
        auVar142._12_4_ = auVar93._12_4_ * auVar173._12_4_ + auVar207._12_4_ * auVar140._12_4_;
        auVar15 = vsubps_avx(auVar15,auVar142);
        auVar173 = vandps_avx(auVar286,auVar103);
        auVar140 = vshufps_avx(auVar173,auVar173,0xf5);
        auVar173 = vmaxss_avx(auVar140,auVar173);
      } while ((float)local_390._0_4_ <= auVar173._0_4_);
      fVar193 = auVar15._0_4_;
      if ((0.0 <= fVar193) && (fVar193 <= 1.0)) {
        auVar93 = vmovshdup_avx(auVar15);
        fVar195 = auVar93._0_4_;
        if ((0.0 <= fVar195) && (fVar195 <= 1.0)) {
          auVar93 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar260 = vinsertps_avx(auVar93,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28)
          ;
          auVar93 = vdpps_avx(auVar260,local_3a0,0x7f);
          auVar207 = vdpps_avx(auVar260,local_3b0,0x7f);
          auVar173 = vdpps_avx(auVar260,local_3c0,0x7f);
          auVar140 = vdpps_avx(auVar260,local_3d0,0x7f);
          auVar128 = vdpps_avx(auVar260,local_3e0,0x7f);
          auVar159 = vdpps_avx(auVar260,local_3f0,0x7f);
          auVar129 = vdpps_avx(auVar260,local_400,0x7f);
          auVar260 = vdpps_avx(auVar260,local_410,0x7f);
          fVar226 = 1.0 - fVar195;
          fVar229 = 1.0 - fVar193;
          fVar197 = auVar15._4_4_;
          fVar200 = auVar15._8_4_;
          fVar221 = auVar15._12_4_;
          fVar224 = fVar229 * fVar193 * fVar193 * 3.0;
          auVar271._0_4_ = fVar193 * fVar193 * fVar193;
          auVar271._4_4_ = fVar197 * fVar197 * fVar197;
          auVar271._8_4_ = fVar200 * fVar200 * fVar200;
          auVar271._12_4_ = fVar221 * fVar221 * fVar221;
          fVar200 = fVar229 * fVar229 * fVar193 * 3.0;
          fVar221 = fVar229 * fVar229 * fVar229;
          fVar197 = fVar221 * (fVar226 * auVar93._0_4_ + fVar195 * auVar128._0_4_) +
                    (fVar226 * auVar207._0_4_ + auVar159._0_4_ * fVar195) * fVar200 +
                    fVar224 * (auVar129._0_4_ * fVar195 + fVar226 * auVar173._0_4_) +
                    auVar271._0_4_ * (fVar226 * auVar140._0_4_ + fVar195 * auVar260._0_4_);
          if (((fVar177 <= fVar197) &&
              (fVar226 = *(float *)(ray + k * 4 + 0x100), fVar197 <= fVar226)) &&
             (pGVar8 = (context->scene->geometries).items[uVar64].ptr,
             (pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
            auStack_f0 = vshufps_avx(auVar15,auVar15,0x55);
            auVar299._8_4_ = 0x3f800000;
            auVar299._0_8_ = 0x3f8000003f800000;
            auVar299._12_4_ = 0x3f800000;
            auVar93 = vsubps_avx(auVar299,auStack_f0);
            fVar242 = auStack_f0._0_4_;
            fVar243 = auStack_f0._4_4_;
            fVar244 = auStack_f0._8_4_;
            fVar227 = auStack_f0._12_4_;
            fVar115 = auVar93._0_4_;
            fVar116 = auVar93._4_4_;
            fVar117 = auVar93._8_4_;
            fVar199 = auVar93._12_4_;
            auVar318._0_4_ = fVar242 * (float)local_4b0._0_4_ + fVar115 * (float)local_490._0_4_;
            auVar318._4_4_ = fVar243 * (float)local_4b0._4_4_ + fVar116 * (float)local_490._4_4_;
            auVar318._8_4_ = fVar244 * fStack_4a8 + fVar117 * fStack_488;
            auVar318._12_4_ = fVar227 * fStack_4a4 + fVar199 * fStack_484;
            auVar325._0_4_ = fVar242 * (float)local_4c0._0_4_ + fVar115 * fVar74;
            auVar325._4_4_ = fVar243 * (float)local_4c0._4_4_ + fVar116 * fVar113;
            auVar325._8_4_ = fVar244 * fStack_4b8 + fVar117 * fVar194;
            auVar325._12_4_ = fVar227 * fStack_4b4 + fVar199 * fVar201;
            auVar334._0_4_ = fVar242 * fVar76 + fVar115 * (float)local_4a0._0_4_;
            auVar334._4_4_ = fVar243 * fVar178 + fVar116 * (float)local_4a0._4_4_;
            auVar334._8_4_ = fVar244 * fVar198 + fVar117 * fStack_498;
            auVar334._12_4_ = fVar227 * fVar225 + fVar199 * fStack_494;
            auVar300._0_4_ = fVar242 * local_4d0 + fVar115 * fVar75;
            auVar300._4_4_ = fVar243 * fStack_4cc + fVar116 * fVar114;
            auVar300._8_4_ = fVar244 * fStack_4c8 + fVar117 * fVar196;
            auVar300._12_4_ = fVar227 * fStack_4c4 + fVar199 * fVar222;
            auVar140 = vsubps_avx(auVar325,auVar318);
            auVar128 = vsubps_avx(auVar334,auVar325);
            auVar159 = vsubps_avx(auVar300,auVar334);
            auStack_110 = vshufps_avx(auVar15,auVar15,0);
            fVar227 = auStack_110._0_4_;
            fVar115 = auStack_110._4_4_;
            fVar116 = auStack_110._8_4_;
            fVar117 = auStack_110._12_4_;
            auVar93 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
            fVar229 = auVar93._0_4_;
            fVar242 = auVar93._4_4_;
            fVar243 = auVar93._8_4_;
            fVar244 = auVar93._12_4_;
            auVar93 = vshufps_avx(auVar271,auVar271,0);
            auVar207 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
            auVar173 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
            auVar258._0_4_ =
                 (fVar229 * (fVar229 * auVar140._0_4_ + fVar227 * auVar128._0_4_) +
                 fVar227 * (fVar229 * auVar128._0_4_ + fVar227 * auVar159._0_4_)) * 3.0;
            auVar258._4_4_ =
                 (fVar242 * (fVar242 * auVar140._4_4_ + fVar115 * auVar128._4_4_) +
                 fVar115 * (fVar242 * auVar128._4_4_ + fVar115 * auVar159._4_4_)) * 3.0;
            auVar258._8_4_ =
                 (fVar243 * (fVar243 * auVar140._8_4_ + fVar116 * auVar128._8_4_) +
                 fVar116 * (fVar243 * auVar128._8_4_ + fVar116 * auVar159._8_4_)) * 3.0;
            auVar258._12_4_ =
                 (fVar244 * (fVar244 * auVar140._12_4_ + fVar117 * auVar128._12_4_) +
                 fVar117 * (fVar244 * auVar128._12_4_ + fVar117 * auVar159._12_4_)) * 3.0;
            auVar140 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
            auVar217._0_4_ =
                 auVar140._0_4_ * (float)local_430._0_4_ +
                 auVar173._0_4_ * (float)local_440._0_4_ +
                 auVar93._0_4_ * (float)local_460._0_4_ + auVar207._0_4_ * (float)local_450._0_4_;
            auVar217._4_4_ =
                 auVar140._4_4_ * (float)local_430._4_4_ +
                 auVar173._4_4_ * (float)local_440._4_4_ +
                 auVar93._4_4_ * (float)local_460._4_4_ + auVar207._4_4_ * (float)local_450._4_4_;
            auVar217._8_4_ =
                 auVar140._8_4_ * fStack_428 +
                 auVar173._8_4_ * fStack_438 +
                 auVar93._8_4_ * fStack_458 + auVar207._8_4_ * fStack_448;
            auVar217._12_4_ =
                 auVar140._12_4_ * fStack_424 +
                 auVar173._12_4_ * fStack_434 +
                 auVar93._12_4_ * fStack_454 + auVar207._12_4_ * fStack_444;
            auVar93 = vshufps_avx(auVar258,auVar258,0xc9);
            auVar239._0_4_ = auVar217._0_4_ * auVar93._0_4_;
            auVar239._4_4_ = auVar217._4_4_ * auVar93._4_4_;
            auVar239._8_4_ = auVar217._8_4_ * auVar93._8_4_;
            auVar239._12_4_ = auVar217._12_4_ * auVar93._12_4_;
            auVar93 = vshufps_avx(auVar217,auVar217,0xc9);
            auVar218._0_4_ = auVar258._0_4_ * auVar93._0_4_;
            auVar218._4_4_ = auVar258._4_4_ * auVar93._4_4_;
            auVar218._8_4_ = auVar258._8_4_ * auVar93._8_4_;
            auVar218._12_4_ = auVar258._12_4_ * auVar93._12_4_;
            auVar93 = vsubps_avx(auVar218,auVar239);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              auStack_170 = vshufps_avx(auVar93,auVar93,0x55);
              auStack_150 = vshufps_avx(auVar93,auVar93,0xaa);
              auStack_130 = vshufps_avx(auVar93,auVar93,0);
              local_180[0] = (RTCHitN)auStack_170[0];
              local_180[1] = (RTCHitN)auStack_170[1];
              local_180[2] = (RTCHitN)auStack_170[2];
              local_180[3] = (RTCHitN)auStack_170[3];
              local_180[4] = (RTCHitN)auStack_170[4];
              local_180[5] = (RTCHitN)auStack_170[5];
              local_180[6] = (RTCHitN)auStack_170[6];
              local_180[7] = (RTCHitN)auStack_170[7];
              local_180[8] = (RTCHitN)auStack_170[8];
              local_180[9] = (RTCHitN)auStack_170[9];
              local_180[10] = (RTCHitN)auStack_170[10];
              local_180[0xb] = (RTCHitN)auStack_170[0xb];
              local_180[0xc] = (RTCHitN)auStack_170[0xc];
              local_180[0xd] = (RTCHitN)auStack_170[0xd];
              local_180[0xe] = (RTCHitN)auStack_170[0xe];
              local_180[0xf] = (RTCHitN)auStack_170[0xf];
              local_160 = auStack_150;
              local_140 = auStack_130;
              local_120 = auStack_110;
              local_100 = auStack_f0;
              local_e0 = local_320._0_8_;
              uStack_d8 = local_320._8_8_;
              uStack_d0 = local_320._16_8_;
              uStack_c8 = local_320._24_8_;
              local_c0 = local_300;
              vcmpps_avx(local_300,local_300,0xf);
              uStack_9c = context->user->instID[0];
              local_a0 = uStack_9c;
              uStack_98 = uStack_9c;
              uStack_94 = uStack_9c;
              uStack_90 = uStack_9c;
              uStack_8c = uStack_9c;
              uStack_88 = uStack_9c;
              uStack_84 = uStack_9c;
              uStack_7c = context->user->instPrimID[0];
              local_80 = uStack_7c;
              uStack_78 = uStack_7c;
              uStack_74 = uStack_7c;
              uStack_70 = uStack_7c;
              uStack_6c = uStack_7c;
              uStack_68 = uStack_7c;
              uStack_64 = uStack_7c;
              *(float *)(ray + k * 4 + 0x100) = fVar197;
              local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar71 & 0xf) << 4));
              local_510 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar71 >> 4) * 0x10)
              ;
              local_500.valid = (int *)local_520;
              local_500.geometryUserPtr = pGVar8->userPtr;
              local_500.context = context->user;
              local_500.hit = local_180;
              local_500.N = 8;
              local_500.ray = (RTCRayN *)ray;
              if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->intersectionFilterN)(&local_500);
              }
              auVar93 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
              auVar207 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
              auVar176._16_16_ = auVar207;
              auVar176._0_16_ = auVar93;
              auVar105 = _DAT_01f7b020 & ~auVar176;
              if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar105 >> 0x7f,0) != '\0') ||
                    (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar105 >> 0xbf,0) != '\0') ||
                  (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar105[0x1f] < '\0') {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var13)(&local_500);
                }
                auVar93 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                auVar207 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                auVar111._16_16_ = auVar207;
                auVar111._0_16_ = auVar93;
                auVar105 = _DAT_01f7b020 & ~auVar111;
                if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar105 >> 0x7f,0) != '\0') ||
                      (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar105 >> 0xbf,0) != '\0') ||
                    (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar105[0x1f] < '\0') {
                  auVar112._0_8_ = auVar93._0_8_ ^ 0xffffffffffffffff;
                  auVar112._8_4_ = auVar93._8_4_ ^ 0xffffffff;
                  auVar112._12_4_ = auVar93._12_4_ ^ 0xffffffff;
                  auVar112._16_4_ = auVar207._0_4_ ^ 0xffffffff;
                  auVar112._20_4_ = auVar207._4_4_ ^ 0xffffffff;
                  auVar112._24_4_ = auVar207._8_4_ ^ 0xffffffff;
                  auVar112._28_4_ = auVar207._12_4_ ^ 0xffffffff;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])local_500.hit);
                  *(undefined1 (*) [32])(local_500.ray + 0x180) = auVar105;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])(local_500.hit + 0x20));
                  *(undefined1 (*) [32])(local_500.ray + 0x1a0) = auVar105;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])(local_500.hit + 0x40));
                  *(undefined1 (*) [32])(local_500.ray + 0x1c0) = auVar105;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])(local_500.hit + 0x60));
                  *(undefined1 (*) [32])(local_500.ray + 0x1e0) = auVar105;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])(local_500.hit + 0x80));
                  *(undefined1 (*) [32])(local_500.ray + 0x200) = auVar105;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])(local_500.hit + 0xa0));
                  *(undefined1 (*) [32])(local_500.ray + 0x220) = auVar105;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])(local_500.hit + 0xc0));
                  *(undefined1 (*) [32])(local_500.ray + 0x240) = auVar105;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])(local_500.hit + 0xe0));
                  *(undefined1 (*) [32])(local_500.ray + 0x260) = auVar105;
                  auVar105 = vmaskmovps_avx(auVar112,*(undefined1 (*) [32])(local_500.hit + 0x100));
                  *(undefined1 (*) [32])(local_500.ray + 0x280) = auVar105;
                  goto LAB_0094e41e;
                }
              }
              *(float *)(ray + k * 4 + 0x100) = fVar226;
              goto LAB_0094e41e;
            }
            *(float *)(ray + k * 4 + 0x100) = fVar197;
            uVar73 = vextractps_avx(auVar93,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar73;
            uVar73 = vextractps_avx(auVar93,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar73;
            *(int *)(ray + k * 4 + 0x1c0) = auVar93._0_4_;
            *(float *)(ray + k * 4 + 0x1e0) = fVar193;
            *(float *)(ray + k * 4 + 0x200) = fVar195;
            *(uint *)(ray + k * 4 + 0x220) = uVar7;
            *(uint *)(ray + k * 4 + 0x240) = uVar64;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
        }
      }
      goto LAB_0094e41e;
    }
    auVar93 = vinsertps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar193),0x10);
    auVar362 = ZEXT1664(auVar93);
    auVar356 = ZEXT1664(auVar257);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }